

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  int iVar21;
  long lVar22;
  undefined4 uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [12];
  ulong uVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  byte bVar70;
  uint uVar71;
  int iVar72;
  undefined1 (*pauVar73) [32];
  uint uVar74;
  uint uVar75;
  ulong uVar76;
  ulong uVar77;
  bool bVar78;
  bool bVar79;
  float fVar80;
  undefined8 uVar82;
  float fVar115;
  vint4 bi_2;
  undefined1 auVar83 [16];
  float fVar114;
  float fVar116;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined4 uVar81;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar87 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 extraout_var [60];
  undefined1 auVar113 [64];
  float fVar117;
  float fVar118;
  float fVar140;
  float fVar142;
  vint4 bi_1;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar141;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar152 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar187;
  vint4 ai_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar188;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  vint4 ai;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [28];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  vint4 bi;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  vint4 ai_1;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar242;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar243 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [64];
  undefined1 auVar260 [32];
  float fVar252;
  float fVar253;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar251 [32];
  undefined1 auVar258 [16];
  float fVar263;
  float fVar264;
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar265 [16];
  undefined1 auVar266 [28];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_cc4;
  uint uStack_c04;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  float fStack_b44;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  uint uStack_ab0;
  uint uStack_aac;
  uint uStack_aa8;
  uint uStack_aa4;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  undefined1 auStack_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  Primitive *local_930;
  ulong local_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  uint local_7e0;
  uint uStack_7dc;
  uint uStack_7d8;
  uint uStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  uint uStack_7c4;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  uint local_640;
  uint uStack_63c;
  uint uStack_638;
  uint uStack_634;
  uint uStack_630;
  uint uStack_62c;
  uint uStack_628;
  uint uStack_624;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  uint local_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var_00 [60];
  undefined1 auVar259 [16];
  
  PVar1 = prim[1];
  uVar77 = (ulong)(byte)PVar1;
  fVar80 = *(float *)(prim + uVar77 * 0x19 + 0x12);
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar4 = vsubps_avx(auVar4,*(undefined1 (*) [16])(prim + uVar77 * 0x19 + 6));
  auVar83._0_4_ = fVar80 * auVar4._0_4_;
  auVar83._4_4_ = fVar80 * auVar4._4_4_;
  auVar83._8_4_ = fVar80 * auVar4._8_4_;
  auVar83._12_4_ = fVar80 * auVar4._12_4_;
  auVar211._0_4_ = fVar80 * auVar5._0_4_;
  auVar211._4_4_ = fVar80 * auVar5._4_4_;
  auVar211._8_4_ = fVar80 * auVar5._8_4_;
  auVar211._12_4_ = fVar80 * auVar5._12_4_;
  auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 4 + 6)));
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 5 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 6 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar77 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar1 * 0xc) + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar1 * 0xc + uVar77 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  uVar76 = (ulong)(uint)((int)(uVar77 * 9) * 2);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + uVar77 + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  uVar76 = (ulong)(uint)((int)(uVar77 * 5) << 2);
  auVar152 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar76 + 6)));
  auVar152 = vcvtdq2ps_avx(auVar152);
  auVar273._4_4_ = auVar211._0_4_;
  auVar273._0_4_ = auVar211._0_4_;
  auVar273._8_4_ = auVar211._0_4_;
  auVar273._12_4_ = auVar211._0_4_;
  auVar120 = vshufps_avx(auVar211,auVar211,0x55);
  auVar84 = vshufps_avx(auVar211,auVar211,0xaa);
  fVar80 = auVar84._0_4_;
  auVar258._0_4_ = fVar80 * auVar6._0_4_;
  fVar114 = auVar84._4_4_;
  auVar258._4_4_ = fVar114 * auVar6._4_4_;
  fVar115 = auVar84._8_4_;
  auVar258._8_4_ = fVar115 * auVar6._8_4_;
  fVar116 = auVar84._12_4_;
  auVar258._12_4_ = fVar116 * auVar6._12_4_;
  auVar249._0_4_ = auVar9._0_4_ * fVar80;
  auVar249._4_4_ = auVar9._4_4_ * fVar114;
  auVar249._8_4_ = auVar9._8_4_ * fVar115;
  auVar249._12_4_ = auVar9._12_4_ * fVar116;
  auVar236._0_4_ = auVar152._0_4_ * fVar80;
  auVar236._4_4_ = auVar152._4_4_ * fVar114;
  auVar236._8_4_ = auVar152._8_4_ * fVar115;
  auVar236._12_4_ = auVar152._12_4_ * fVar116;
  auVar84 = vfmadd231ps_fma(auVar258,auVar120,auVar5);
  auVar93 = vfmadd231ps_fma(auVar249,auVar120,auVar8);
  auVar120 = vfmadd231ps_fma(auVar236,auVar85,auVar120);
  auVar89 = vfmadd231ps_fma(auVar84,auVar273,auVar4);
  auVar93 = vfmadd231ps_fma(auVar93,auVar273,auVar7);
  auVar193 = vfmadd231ps_fma(auVar120,auVar86,auVar273);
  auVar274._4_4_ = auVar83._0_4_;
  auVar274._0_4_ = auVar83._0_4_;
  auVar274._8_4_ = auVar83._0_4_;
  auVar274._12_4_ = auVar83._0_4_;
  auVar120 = vshufps_avx(auVar83,auVar83,0x55);
  auVar84 = vshufps_avx(auVar83,auVar83,0xaa);
  fVar80 = auVar84._0_4_;
  auVar212._0_4_ = fVar80 * auVar6._0_4_;
  fVar114 = auVar84._4_4_;
  auVar212._4_4_ = fVar114 * auVar6._4_4_;
  fVar115 = auVar84._8_4_;
  auVar212._8_4_ = fVar115 * auVar6._8_4_;
  fVar116 = auVar84._12_4_;
  auVar212._12_4_ = fVar116 * auVar6._12_4_;
  auVar119._0_4_ = auVar9._0_4_ * fVar80;
  auVar119._4_4_ = auVar9._4_4_ * fVar114;
  auVar119._8_4_ = auVar9._8_4_ * fVar115;
  auVar119._12_4_ = auVar9._12_4_ * fVar116;
  auVar84._0_4_ = auVar152._0_4_ * fVar80;
  auVar84._4_4_ = auVar152._4_4_ * fVar114;
  auVar84._8_4_ = auVar152._8_4_ * fVar115;
  auVar84._12_4_ = auVar152._12_4_ * fVar116;
  auVar5 = vfmadd231ps_fma(auVar212,auVar120,auVar5);
  auVar6 = vfmadd231ps_fma(auVar119,auVar120,auVar8);
  auVar8 = vfmadd231ps_fma(auVar84,auVar120,auVar85);
  auVar9 = vfmadd231ps_fma(auVar5,auVar274,auVar4);
  auVar85 = vfmadd231ps_fma(auVar6,auVar274,auVar7);
  auVar152 = vfmadd231ps_fma(auVar8,auVar274,auVar86);
  auVar231._8_4_ = 0x7fffffff;
  auVar231._0_8_ = 0x7fffffff7fffffff;
  auVar231._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx(auVar89,auVar231);
  auVar192._8_4_ = 0x219392ef;
  auVar192._0_8_ = 0x219392ef219392ef;
  auVar192._12_4_ = 0x219392ef;
  auVar4 = vcmpps_avx(auVar4,auVar192,1);
  auVar5 = vblendvps_avx(auVar89,auVar192,auVar4);
  auVar4 = vandps_avx(auVar93,auVar231);
  auVar4 = vcmpps_avx(auVar4,auVar192,1);
  auVar6 = vblendvps_avx(auVar93,auVar192,auVar4);
  auVar4 = vandps_avx(auVar193,auVar231);
  auVar4 = vcmpps_avx(auVar4,auVar192,1);
  auVar4 = vblendvps_avx(auVar193,auVar192,auVar4);
  auVar7 = vrcpps_avx(auVar5);
  auVar232._8_4_ = 0x3f800000;
  auVar232._0_8_ = 0x3f8000003f800000;
  auVar232._12_4_ = 0x3f800000;
  auVar5 = vfnmadd213ps_fma(auVar5,auVar7,auVar232);
  auVar7 = vfmadd132ps_fma(auVar5,auVar7,auVar7);
  auVar5 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar5,auVar232);
  auVar8 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar5 = vrcpps_avx(auVar4);
  auVar4 = vfnmadd213ps_fma(auVar4,auVar5,auVar232);
  auVar86 = vfmadd132ps_fma(auVar4,auVar5,auVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar77 * 7 + 6);
  auVar4 = vpmovsxwd_avx(auVar4);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar193._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar193._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar193._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar193._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar77 * 9 + 6);
  auVar4 = vpmovsxwd_avx(auVar5);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar213._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar213._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar213._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar213._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar93._1_3_ = 0;
  auVar93[0] = PVar1;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + uVar77 * -2 + 6);
  auVar4 = vpmovsxwd_avx(auVar7);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar85);
  auVar237._0_4_ = auVar4._0_4_ * auVar8._0_4_;
  auVar237._4_4_ = auVar4._4_4_ * auVar8._4_4_;
  auVar237._8_4_ = auVar4._8_4_ * auVar8._8_4_;
  auVar237._12_4_ = auVar4._12_4_ * auVar8._12_4_;
  auVar4 = vcvtdq2ps_avx(auVar5);
  auVar4 = vsubps_avx(auVar4,auVar85);
  auVar120._0_4_ = auVar8._0_4_ * auVar4._0_4_;
  auVar120._4_4_ = auVar8._4_4_ * auVar4._4_4_;
  auVar120._8_4_ = auVar8._8_4_ * auVar4._8_4_;
  auVar120._12_4_ = auVar8._12_4_ * auVar4._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar76 + uVar77 + 6);
  auVar4 = vpmovsxwd_avx(auVar8);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar152);
  auVar89._0_4_ = auVar86._0_4_ * auVar4._0_4_;
  auVar89._4_4_ = auVar86._4_4_ * auVar4._4_4_;
  auVar89._8_4_ = auVar86._8_4_ * auVar4._8_4_;
  auVar89._12_4_ = auVar86._12_4_ * auVar4._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar77 * 0x17 + 6);
  auVar4 = vpmovsxwd_avx(auVar9);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar152);
  auVar85._0_4_ = auVar86._0_4_ * auVar4._0_4_;
  auVar85._4_4_ = auVar86._4_4_ * auVar4._4_4_;
  auVar85._8_4_ = auVar86._8_4_ * auVar4._8_4_;
  auVar85._12_4_ = auVar86._12_4_ * auVar4._12_4_;
  auVar4 = vpminsd_avx(auVar193,auVar213);
  auVar5 = vpminsd_avx(auVar237,auVar120);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  auVar5 = vpminsd_avx(auVar89,auVar85);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar243._4_4_ = uVar81;
  auVar243._0_4_ = uVar81;
  auVar243._8_4_ = uVar81;
  auVar243._12_4_ = uVar81;
  auVar5 = vmaxps_avx(auVar5,auVar243);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  local_6c0._0_4_ = auVar4._0_4_ * 0.99999964;
  local_6c0._4_4_ = auVar4._4_4_ * 0.99999964;
  local_6c0._8_4_ = auVar4._8_4_ * 0.99999964;
  local_6c0._12_4_ = auVar4._12_4_ * 0.99999964;
  auVar4 = vpmaxsd_avx(auVar193,auVar213);
  auVar5 = vpmaxsd_avx(auVar237,auVar120);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar5 = vpmaxsd_avx(auVar89,auVar85);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar152._4_4_ = uVar81;
  auVar152._0_4_ = uVar81;
  auVar152._8_4_ = uVar81;
  auVar152._12_4_ = uVar81;
  auVar5 = vminps_avx(auVar5,auVar152);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar86._0_4_ = auVar4._0_4_ * 1.0000004;
  auVar86._4_4_ = auVar4._4_4_ * 1.0000004;
  auVar86._8_4_ = auVar4._8_4_ * 1.0000004;
  auVar86._12_4_ = auVar4._12_4_ * 1.0000004;
  auVar93[4] = PVar1;
  auVar93._5_3_ = 0;
  auVar93[8] = PVar1;
  auVar93._9_3_ = 0;
  auVar93[0xc] = PVar1;
  auVar93._13_3_ = 0;
  auVar5 = vpcmpgtd_avx(auVar93,_DAT_01f7fcf0);
  auVar4 = vcmpps_avx(local_6c0,auVar86,2);
  auVar4 = vandps_avx(auVar4,auVar5);
  uVar71 = vmovmskps_avx(auVar4);
  if (uVar71 == 0) {
    return false;
  }
  uVar71 = uVar71 & 0xff;
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_5e0 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  iVar72 = 1 << ((uint)k & 0x1f);
  auVar98._4_4_ = iVar72;
  auVar98._0_4_ = iVar72;
  auVar98._8_4_ = iVar72;
  auVar98._12_4_ = iVar72;
  auVar98._16_4_ = iVar72;
  auVar98._20_4_ = iVar72;
  auVar98._24_4_ = iVar72;
  auVar98._28_4_ = iVar72;
  auVar165 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar97 = vpand_avx2(auVar98,auVar165);
  local_6a0 = vpcmpeqd_avx2(auVar97,auVar165);
  local_8c0 = 0x7fffffff;
  uStack_8bc = 0x7fffffff;
  uStack_8b8 = 0x7fffffff;
  uStack_8b4 = 0x7fffffff;
  uStack_8b0 = 0x7fffffff;
  uStack_8ac = 0x7fffffff;
  uStack_8a8 = 0x7fffffff;
  uStack_8a4 = 0x7fffffff;
  local_7e0 = 0x80000000;
  uStack_7dc = 0x80000000;
  uStack_7d8 = 0x80000000;
  uStack_7d4 = 0x80000000;
  fStack_7d0 = -0.0;
  fStack_7cc = -0.0;
  fStack_7c8 = -0.0;
  uStack_7c4 = 0x80000000;
  local_930 = prim;
LAB_0163ab5f:
  lVar22 = 0;
  local_928 = (ulong)uVar71;
  for (uVar76 = local_928; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    lVar22 = lVar22 + 1;
  }
  uVar71 = *(uint *)(local_930 + 2);
  local_660 = *(uint *)(local_930 + lVar22 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar71].ptr;
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_660);
  p_Var3 = pGVar2[1].intersectionFilterN;
  lVar22 = *(long *)&pGVar2[1].time_range.upper;
  auVar4 = *(undefined1 (*) [16])(lVar22 + (long)p_Var3 * uVar76);
  auVar5 = *(undefined1 (*) [16])(lVar22 + (uVar76 + 1) * (long)p_Var3);
  auVar6 = *(undefined1 (*) [16])(lVar22 + (uVar76 + 2) * (long)p_Var3);
  local_928 = local_928 - 1 & local_928;
  auVar7 = *(undefined1 (*) [16])(lVar22 + (uVar76 + 3) * (long)p_Var3);
  if (local_928 != 0) {
    uVar77 = local_928 - 1 & local_928;
    for (uVar76 = local_928; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    }
    if (uVar77 != 0) {
      for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar9 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar250._4_4_ = uVar81;
  auVar250._0_4_ = uVar81;
  auVar250._8_4_ = uVar81;
  auVar250._12_4_ = uVar81;
  fStack_890 = (float)uVar81;
  _local_8a0 = auVar250;
  fStack_88c = (float)uVar81;
  fStack_888 = (float)uVar81;
  register0x0000149c = uVar81;
  uVar81 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar259._4_4_ = uVar81;
  auVar259._0_4_ = uVar81;
  auVar259._8_4_ = uVar81;
  auVar259._12_4_ = uVar81;
  fStack_ad0 = (float)uVar81;
  _local_ae0 = auVar259;
  fStack_acc = (float)uVar81;
  fStack_ac8 = (float)uVar81;
  register0x000014dc = uVar81;
  auVar261 = ZEXT3264(_local_ae0);
  auVar8 = vunpcklps_avx(auVar250,auVar259);
  fVar80 = *(float *)(ray + k * 4 + 0xc0);
  auVar265._4_4_ = fVar80;
  auVar265._0_4_ = fVar80;
  auVar265._8_4_ = fVar80;
  auVar265._12_4_ = fVar80;
  fStack_a10 = fVar80;
  _local_a20 = auVar265;
  fStack_a0c = fVar80;
  fStack_a08 = fVar80;
  register0x0000151c = fVar80;
  local_a30 = vinsertps_avx(auVar8,auVar265,0x28);
  auVar214._0_4_ = (auVar4._0_4_ + auVar5._0_4_ + auVar6._0_4_ + auVar7._0_4_) * 0.25;
  auVar214._4_4_ = (auVar4._4_4_ + auVar5._4_4_ + auVar6._4_4_ + auVar7._4_4_) * 0.25;
  auVar214._8_4_ = (auVar4._8_4_ + auVar5._8_4_ + auVar6._8_4_ + auVar7._8_4_) * 0.25;
  auVar214._12_4_ = (auVar4._12_4_ + auVar5._12_4_ + auVar6._12_4_ + auVar7._12_4_) * 0.25;
  auVar8 = vsubps_avx(auVar214,auVar9);
  auVar8 = vdpps_avx(auVar8,local_a30,0x7f);
  local_a40 = vdpps_avx(local_a30,local_a30,0x7f);
  auVar248 = ZEXT1664(local_a40);
  auVar86 = vrcpss_avx(local_a40,local_a40);
  auVar85 = vfnmadd213ss_fma(auVar86,local_a40,ZEXT416(0x40000000));
  local_380 = auVar8._0_4_ * auVar86._0_4_ * auVar85._0_4_;
  auVar225._4_4_ = local_380;
  auVar225._0_4_ = local_380;
  auVar225._8_4_ = local_380;
  auVar225._12_4_ = local_380;
  fStack_970 = local_380;
  _local_980 = auVar225;
  fStack_96c = local_380;
  fStack_968 = local_380;
  fStack_964 = local_380;
  auVar8 = vfmadd231ps_fma(auVar9,local_a30,auVar225);
  auVar8 = vblendps_avx(auVar8,_DAT_01f7aa10,8);
  auVar9 = vsubps_avx(auVar4,auVar8);
  auVar86 = vsubps_avx(auVar6,auVar8);
  auVar85 = vsubps_avx(auVar5,auVar8);
  auVar7 = vsubps_avx(auVar7,auVar8);
  auVar4 = vmovshdup_avx(auVar9);
  uVar82 = auVar4._0_8_;
  auVar201._8_8_ = uVar82;
  auVar201._0_8_ = uVar82;
  auVar201._16_8_ = uVar82;
  auVar201._24_8_ = uVar82;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  uVar82 = auVar5._0_8_;
  auVar238._8_8_ = uVar82;
  auVar238._0_8_ = uVar82;
  auVar238._16_8_ = uVar82;
  auVar238._24_8_ = uVar82;
  auVar4 = vshufps_avx(auVar9,auVar9,0xff);
  local_1e0 = auVar4._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar4 = vmovshdup_avx(auVar85);
  uVar82 = auVar4._0_8_;
  local_600._8_8_ = uVar82;
  local_600._0_8_ = uVar82;
  local_600._16_8_ = uVar82;
  local_600._24_8_ = uVar82;
  auVar4 = vshufps_avx(auVar85,auVar85,0xaa);
  local_200 = auVar4._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar4 = vshufps_avx(auVar85,auVar85,0xff);
  local_220 = auVar4._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar4 = vmovshdup_avx(auVar86);
  local_5a0 = auVar4._0_4_;
  fStack_59c = auVar4._4_4_;
  auVar4 = vshufps_avx(auVar86,auVar86,0xaa);
  local_240 = auVar4._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar4 = vshufps_avx(auVar86,auVar86,0xff);
  local_5c0 = auVar4._0_4_;
  fStack_5bc = auVar4._4_4_;
  auVar4 = vmovshdup_avx(auVar7);
  local_260 = auVar4._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar4 = vshufps_avx(auVar7,auVar7,0xaa);
  local_280 = auVar4._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar4 = vshufps_avx(auVar7,auVar7,0xff);
  local_2a0 = auVar4._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar4 = vfmadd231ps_fma(ZEXT432((uint)(fVar80 * fVar80)),_local_ae0,_local_ae0);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_8a0,_local_8a0);
  uVar81 = auVar4._0_4_;
  local_2c0._4_4_ = uVar81;
  local_2c0._0_4_ = uVar81;
  local_2c0._8_4_ = uVar81;
  local_2c0._12_4_ = uVar81;
  local_2c0._16_4_ = uVar81;
  local_2c0._20_4_ = uVar81;
  local_2c0._24_4_ = uVar81;
  local_2c0._28_4_ = uVar81;
  fVar80 = *(float *)(ray + k * 4 + 0x60);
  local_940 = ZEXT416((uint)local_380);
  local_380 = fVar80 - local_380;
  fStack_37c = local_380;
  fStack_378 = local_380;
  fStack_374 = local_380;
  fStack_370 = local_380;
  fStack_36c = local_380;
  fStack_368 = local_380;
  fStack_364 = local_380;
  local_cc4 = 1;
  uVar76 = 0;
  bVar78 = false;
  uVar81 = auVar9._0_4_;
  local_300._4_4_ = uVar81;
  local_300._0_4_ = uVar81;
  local_300._8_4_ = uVar81;
  local_300._12_4_ = uVar81;
  local_300._16_4_ = uVar81;
  local_300._20_4_ = uVar81;
  local_300._24_4_ = uVar81;
  local_300._28_4_ = uVar81;
  fVar114 = auVar85._0_4_;
  local_320._4_4_ = fVar114;
  local_320._0_4_ = fVar114;
  local_320._8_4_ = fVar114;
  local_320._12_4_ = fVar114;
  local_320._16_4_ = fVar114;
  local_320._20_4_ = fVar114;
  local_320._24_4_ = fVar114;
  local_320._28_4_ = fVar114;
  fVar115 = auVar86._0_4_;
  local_340._4_4_ = fVar115;
  local_340._0_4_ = fVar115;
  local_340._8_4_ = fVar115;
  local_340._12_4_ = fVar115;
  local_340._16_4_ = fVar115;
  local_340._20_4_ = fVar115;
  local_340._24_4_ = fVar115;
  local_340._28_4_ = fVar115;
  fVar116 = auVar7._0_4_;
  auVar165._4_4_ = uStack_8bc;
  auVar165._0_4_ = local_8c0;
  auVar165._8_4_ = uStack_8b8;
  auVar165._12_4_ = uStack_8b4;
  auVar165._16_4_ = uStack_8b0;
  auVar165._20_4_ = uStack_8ac;
  auVar165._24_4_ = uStack_8a8;
  auVar165._28_4_ = uStack_8a4;
  local_620 = vandps_avx(local_2c0,auVar165);
  auVar4 = vsqrtss_avx(local_a40,local_a40);
  auVar6 = vsqrtss_avx(local_a40,local_a40);
  local_6b0 = ZEXT816(0x3f80000000000000);
  local_360 = fVar116;
  fStack_35c = fVar116;
  fStack_358 = fVar116;
  fStack_354 = fVar116;
  fStack_350 = fVar116;
  fStack_34c = fVar116;
  fStack_348 = fVar116;
  fStack_344 = fVar116;
  uStack_65c = local_660;
  uStack_658 = local_660;
  uStack_654 = local_660;
  uStack_650 = local_660;
  uStack_64c = local_660;
  uStack_648 = local_660;
  uStack_644 = local_660;
  local_640 = uVar71;
  uStack_63c = uVar71;
  uStack_638 = uVar71;
  uStack_634 = uVar71;
  uStack_630 = uVar71;
  uStack_62c = uVar71;
  uStack_628 = uVar71;
  uStack_624 = uVar71;
  fStack_5b8 = local_5c0;
  fStack_5b4 = fStack_5bc;
  fStack_5b0 = local_5c0;
  fStack_5ac = fStack_5bc;
  fStack_5a8 = local_5c0;
  fStack_5a4 = fStack_5bc;
  fStack_598 = local_5a0;
  fStack_594 = fStack_59c;
  fStack_590 = local_5a0;
  fStack_58c = fStack_59c;
  fStack_588 = local_5a0;
  fStack_584 = fStack_59c;
  auVar97 = local_2c0;
  do {
    auVar202._8_4_ = 0x3f800000;
    auVar202._0_8_ = 0x3f8000003f800000;
    auVar202._12_4_ = 0x3f800000;
    auVar202._16_4_ = 0x3f800000;
    auVar202._20_4_ = 0x3f800000;
    auVar202._24_4_ = 0x3f800000;
    auVar202._28_4_ = 0x3f800000;
    iVar72 = (int)uVar76;
    auVar8 = vmovshdup_avx(local_6b0);
    auVar8 = vsubps_avx(auVar8,local_6b0);
    fVar143 = auVar8._0_4_;
    fVar150 = fVar143 * 0.04761905;
    local_820._0_4_ = local_6b0._0_4_;
    local_820._4_4_ = local_820._0_4_;
    local_820._8_4_ = local_820._0_4_;
    local_820._12_4_ = local_820._0_4_;
    local_820._16_4_ = local_820._0_4_;
    local_820._20_4_ = local_820._0_4_;
    local_820._24_4_ = local_820._0_4_;
    local_820._28_4_ = local_820._0_4_;
    local_840._4_4_ = fVar143;
    local_840._0_4_ = fVar143;
    local_840._8_4_ = fVar143;
    local_840._12_4_ = fVar143;
    local_840._16_4_ = fVar143;
    local_840._20_4_ = fVar143;
    local_840._24_4_ = fVar143;
    local_840._28_4_ = fVar143;
    auVar8 = vfmadd231ps_fma(local_820,local_840,_DAT_01faff20);
    auVar165 = vsubps_avx(auVar202,ZEXT1632(auVar8));
    fVar118 = auVar8._0_4_;
    auVar262._0_4_ = local_320._0_4_ * fVar118;
    fVar117 = auVar8._4_4_;
    auVar262._4_4_ = local_320._4_4_ * fVar117;
    fVar141 = auVar8._8_4_;
    auVar262._8_4_ = local_320._8_4_ * fVar141;
    fVar140 = auVar8._12_4_;
    auVar262._12_4_ = local_320._12_4_ * fVar140;
    auVar262._16_4_ = local_320._16_4_ * 0.0;
    auVar262._20_4_ = local_320._20_4_ * 0.0;
    auVar262._28_36_ = auVar261._28_36_;
    auVar262._24_4_ = local_320._24_4_ * 0.0;
    auVar69._4_4_ = local_600._4_4_ * fVar117;
    auVar69._0_4_ = local_600._0_4_ * fVar118;
    auVar69._8_4_ = local_600._8_4_ * fVar141;
    auVar69._12_4_ = local_600._12_4_ * fVar140;
    auVar69._16_4_ = local_600._16_4_ * 0.0;
    auVar69._20_4_ = local_600._20_4_ * 0.0;
    auVar69._24_4_ = local_600._24_4_ * 0.0;
    auVar69._28_4_ = auVar97._28_4_;
    auVar67._8_8_ = uStack_1f8;
    auVar67._0_8_ = local_200;
    auVar67._16_8_ = uStack_1f0;
    auVar67._24_8_ = uStack_1e8;
    auVar261._0_4_ = (float)local_200 * fVar118;
    auVar261._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar117;
    auVar261._8_4_ = (float)uStack_1f8 * fVar141;
    auVar261._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar140;
    auVar261._16_4_ = (float)uStack_1f0 * 0.0;
    auVar261._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar261._28_36_ = auVar248._28_36_;
    auVar261._24_4_ = (float)uStack_1e8 * 0.0;
    auVar66._8_8_ = uStack_218;
    auVar66._0_8_ = local_220;
    auVar66._16_8_ = uStack_210;
    auVar66._24_8_ = uStack_208;
    auVar160._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar117;
    auVar160._0_4_ = (float)local_220 * fVar118;
    auVar160._8_4_ = (float)uStack_218 * fVar141;
    auVar160._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar140;
    auVar160._16_4_ = (float)uStack_210 * 0.0;
    auVar160._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar160._24_4_ = (float)uStack_208 * 0.0;
    auVar160._28_4_ = fVar143;
    auVar8 = vfmadd231ps_fma(auVar262._0_32_,auVar165,local_300);
    auVar152 = vfmadd231ps_fma(auVar69,auVar165,auVar201);
    auVar120 = vfmadd231ps_fma(auVar261._0_32_,auVar165,auVar238);
    auVar68._8_8_ = uStack_1d8;
    auVar68._0_8_ = local_1e0;
    auVar68._16_8_ = uStack_1d0;
    auVar68._24_8_ = uStack_1c8;
    auVar84 = vfmadd231ps_fma(auVar160,auVar165,auVar68);
    auVar12._4_4_ = local_340._4_4_ * fVar117;
    auVar12._0_4_ = local_340._0_4_ * fVar118;
    auVar12._8_4_ = local_340._8_4_ * fVar141;
    auVar12._12_4_ = local_340._12_4_ * fVar140;
    auVar12._16_4_ = local_340._16_4_ * 0.0;
    auVar12._20_4_ = local_340._20_4_ * 0.0;
    auVar12._24_4_ = local_340._24_4_ * 0.0;
    auVar12._28_4_ = auVar5._4_4_;
    auVar182._4_4_ = fVar117 * fStack_59c;
    auVar182._0_4_ = fVar118 * local_5a0;
    auVar182._8_4_ = fVar141 * fStack_598;
    auVar182._12_4_ = fVar140 * fStack_594;
    auVar182._16_4_ = fStack_590 * 0.0;
    auVar182._20_4_ = fStack_58c * 0.0;
    auVar182._24_4_ = fStack_588 * 0.0;
    auVar182._28_4_ = local_300._28_4_;
    auVar65._8_8_ = uStack_238;
    auVar65._0_8_ = local_240;
    auVar65._16_8_ = uStack_230;
    auVar65._24_8_ = uStack_228;
    auVar13._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar117;
    auVar13._0_4_ = (float)local_240 * fVar118;
    auVar13._8_4_ = (float)uStack_238 * fVar141;
    auVar13._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar140;
    auVar13._16_4_ = (float)uStack_230 * 0.0;
    auVar13._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    uVar81 = (undefined4)((ulong)uStack_208 >> 0x20);
    auVar13._24_4_ = (float)uStack_228 * 0.0;
    auVar13._28_4_ = uVar81;
    auVar14._4_4_ = fVar117 * fStack_5bc;
    auVar14._0_4_ = fVar118 * local_5c0;
    auVar14._8_4_ = fVar141 * fStack_5b8;
    auVar14._12_4_ = fVar140 * fStack_5b4;
    auVar14._16_4_ = fStack_5b0 * 0.0;
    auVar14._20_4_ = fStack_5ac * 0.0;
    uVar23 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    auVar14._24_4_ = fStack_5a8 * 0.0;
    auVar14._28_4_ = uVar23;
    auVar93 = vfmadd231ps_fma(auVar12,auVar165,local_320);
    auVar89 = vfmadd231ps_fma(auVar182,auVar165,local_600);
    auVar193 = vfmadd231ps_fma(auVar13,auVar165,auVar67);
    auVar83 = vfmadd231ps_fma(auVar14,auVar165,auVar66);
    auVar207._4_4_ = fStack_35c * fVar117;
    auVar207._0_4_ = local_360 * fVar118;
    auVar207._8_4_ = fStack_358 * fVar141;
    auVar207._12_4_ = fStack_354 * fVar140;
    auVar207._16_4_ = fStack_350 * 0.0;
    auVar207._20_4_ = fStack_34c * 0.0;
    auVar207._24_4_ = fStack_348 * 0.0;
    auVar207._28_4_ = fStack_344;
    auVar15._4_4_ = fVar117 * local_260._4_4_;
    auVar15._0_4_ = fVar118 * (float)local_260;
    auVar15._8_4_ = fVar141 * (float)uStack_258;
    auVar15._12_4_ = fVar140 * uStack_258._4_4_;
    auVar15._16_4_ = (float)uStack_250 * 0.0;
    auVar15._20_4_ = uStack_250._4_4_ * 0.0;
    auVar15._24_4_ = (float)uStack_248 * 0.0;
    auVar15._28_4_ = uVar81;
    auVar16._28_4_ = local_320._28_4_;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar93._12_4_ * fVar140,
                            CONCAT48(auVar93._8_4_ * fVar141,
                                     CONCAT44(auVar93._4_4_ * fVar117,auVar93._0_4_ * fVar118))));
    auVar8 = vfmadd231ps_fma(auVar16,auVar165,ZEXT1632(auVar8));
    auVar152 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar140 * auVar89._12_4_,
                                                  CONCAT48(fVar141 * auVar89._8_4_,
                                                           CONCAT44(fVar117 * auVar89._4_4_,
                                                                    fVar118 * auVar89._0_4_)))),
                               auVar165,ZEXT1632(auVar152));
    auVar120 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar140 * auVar193._12_4_,
                                                  CONCAT48(fVar141 * auVar193._8_4_,
                                                           CONCAT44(fVar117 * auVar193._4_4_,
                                                                    fVar118 * auVar193._0_4_)))),
                               auVar165,ZEXT1632(auVar120));
    auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar140 * auVar83._12_4_,
                                                 CONCAT48(fVar141 * auVar83._8_4_,
                                                          CONCAT44(fVar117 * auVar83._4_4_,
                                                                   fVar118 * auVar83._0_4_)))),
                              auVar165,ZEXT1632(auVar84));
    auVar181._4_4_ = fVar117 * local_280._4_4_;
    auVar181._0_4_ = fVar118 * (float)local_280;
    auVar181._8_4_ = fVar141 * (float)uStack_278;
    auVar181._12_4_ = fVar140 * uStack_278._4_4_;
    auVar181._16_4_ = (float)uStack_270 * 0.0;
    auVar181._20_4_ = uStack_270._4_4_ * 0.0;
    auVar181._24_4_ = (float)uStack_268 * 0.0;
    auVar181._28_4_ = local_600._28_4_;
    auVar119 = vfmadd231ps_fma(auVar207,auVar165,local_340);
    auVar93 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar119._12_4_ * fVar140,
                                                 CONCAT48(auVar119._8_4_ * fVar141,
                                                          CONCAT44(auVar119._4_4_ * fVar117,
                                                                   auVar119._0_4_ * fVar118)))),
                              auVar165,ZEXT1632(auVar93));
    auVar239._0_4_ = fVar118 * (float)local_2a0;
    auVar239._4_4_ = fVar117 * local_2a0._4_4_;
    auVar239._8_4_ = fVar141 * (float)uStack_298;
    auVar239._12_4_ = fVar140 * uStack_298._4_4_;
    auVar239._16_4_ = (float)uStack_290 * 0.0;
    auVar239._20_4_ = uStack_290._4_4_ * 0.0;
    auVar239._24_4_ = (float)uStack_288 * 0.0;
    auVar239._28_4_ = 0;
    auVar179._4_4_ = fStack_59c;
    auVar179._0_4_ = local_5a0;
    auVar179._8_4_ = fStack_598;
    auVar179._12_4_ = fStack_594;
    auVar179._16_4_ = fStack_590;
    auVar179._20_4_ = fStack_58c;
    auVar179._24_4_ = fStack_588;
    auVar179._28_4_ = fStack_584;
    auVar119 = vfmadd231ps_fma(auVar15,auVar165,auVar179);
    auVar192 = vfmadd231ps_fma(auVar181,auVar165,auVar65);
    auVar99._4_4_ = fStack_5bc;
    auVar99._0_4_ = local_5c0;
    auVar99._8_4_ = fStack_5b8;
    auVar99._12_4_ = fStack_5b4;
    auVar99._16_4_ = fStack_5b0;
    auVar99._20_4_ = fStack_5ac;
    auVar99._24_4_ = fStack_5a8;
    auVar99._28_4_ = fStack_5a4;
    auVar211 = vfmadd231ps_fma(auVar239,auVar165,auVar99);
    auVar17._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar211._12_4_ * fVar140,
                            CONCAT48(auVar211._8_4_ * fVar141,
                                     CONCAT44(auVar211._4_4_ * fVar117,auVar211._0_4_ * fVar118))));
    auVar89 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar119._12_4_ * fVar140,
                                                 CONCAT48(auVar119._8_4_ * fVar141,
                                                          CONCAT44(auVar119._4_4_ * fVar117,
                                                                   auVar119._0_4_ * fVar118)))),
                              auVar165,ZEXT1632(auVar89));
    auVar193 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar140 * auVar192._12_4_,
                                                  CONCAT48(fVar141 * auVar192._8_4_,
                                                           CONCAT44(fVar117 * auVar192._4_4_,
                                                                    fVar118 * auVar192._0_4_)))),
                               auVar165,ZEXT1632(auVar193));
    auVar83 = vfmadd231ps_fma(auVar17,auVar165,ZEXT1632(auVar83));
    auVar18._28_4_ = local_340._28_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar89._12_4_ * fVar140,
                            CONCAT48(auVar89._8_4_ * fVar141,
                                     CONCAT44(auVar89._4_4_ * fVar117,auVar89._0_4_ * fVar118))));
    auVar19._28_4_ = uVar23;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(fVar140 * auVar193._12_4_,
                            CONCAT48(fVar141 * auVar193._8_4_,
                                     CONCAT44(fVar117 * auVar193._4_4_,fVar118 * auVar193._0_4_))));
    auVar119 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar93._12_4_ * fVar140,
                                                  CONCAT48(auVar93._8_4_ * fVar141,
                                                           CONCAT44(auVar93._4_4_ * fVar117,
                                                                    auVar93._0_4_ * fVar118)))),
                               auVar165,ZEXT1632(auVar8));
    auVar192 = vfmadd231ps_fma(auVar18,auVar165,ZEXT1632(auVar152));
    auVar99 = ZEXT1632(auVar192);
    auVar192 = vfmadd231ps_fma(auVar19,auVar165,ZEXT1632(auVar120));
    auVar211 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar83._12_4_ * fVar140,
                                                  CONCAT48(auVar83._8_4_ * fVar141,
                                                           CONCAT44(auVar83._4_4_ * fVar117,
                                                                    auVar83._0_4_ * fVar118)))),
                               ZEXT1632(auVar84),auVar165);
    auVar165 = vsubps_avx(ZEXT1632(auVar93),ZEXT1632(auVar8));
    auVar97 = vsubps_avx(ZEXT1632(auVar89),ZEXT1632(auVar152));
    auVar98 = vsubps_avx(ZEXT1632(auVar193),ZEXT1632(auVar120));
    auVar160 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar84));
    local_9c0._0_4_ = fVar150 * auVar165._0_4_ * 3.0;
    local_9c0._4_4_ = fVar150 * auVar165._4_4_ * 3.0;
    local_9c0._8_4_ = fVar150 * auVar165._8_4_ * 3.0;
    local_9c0._12_4_ = fVar150 * auVar165._12_4_ * 3.0;
    local_9c0._16_4_ = fVar150 * auVar165._16_4_ * 3.0;
    local_9c0._20_4_ = fVar150 * auVar165._20_4_ * 3.0;
    local_9c0._24_4_ = fVar150 * auVar165._24_4_ * 3.0;
    local_9c0._28_4_ = 0;
    local_9e0._0_4_ = fVar150 * auVar97._0_4_ * 3.0;
    local_9e0._4_4_ = fVar150 * auVar97._4_4_ * 3.0;
    local_9e0._8_4_ = fVar150 * auVar97._8_4_ * 3.0;
    local_9e0._12_4_ = fVar150 * auVar97._12_4_ * 3.0;
    local_9e0._16_4_ = fVar150 * auVar97._16_4_ * 3.0;
    local_9e0._20_4_ = fVar150 * auVar97._20_4_ * 3.0;
    local_9e0._24_4_ = fVar150 * auVar97._24_4_ * 3.0;
    local_9e0._28_4_ = 0;
    auVar246._0_4_ = fVar150 * auVar98._0_4_ * 3.0;
    auVar246._4_4_ = fVar150 * auVar98._4_4_ * 3.0;
    auVar246._8_4_ = fVar150 * auVar98._8_4_ * 3.0;
    auVar246._12_4_ = fVar150 * auVar98._12_4_ * 3.0;
    auVar246._16_4_ = fVar150 * auVar98._16_4_ * 3.0;
    auVar246._20_4_ = fVar150 * auVar98._20_4_ * 3.0;
    auVar246._24_4_ = fVar150 * auVar98._24_4_ * 3.0;
    auVar246._28_4_ = 0;
    fVar117 = fVar150 * auVar160._0_4_ * 3.0;
    fVar140 = fVar150 * auVar160._4_4_ * 3.0;
    auVar20._4_4_ = fVar140;
    auVar20._0_4_ = fVar117;
    fVar142 = fVar150 * auVar160._8_4_ * 3.0;
    auVar20._8_4_ = fVar142;
    fVar144 = fVar150 * auVar160._12_4_ * 3.0;
    auVar20._12_4_ = fVar144;
    fVar146 = fVar150 * auVar160._16_4_ * 3.0;
    auVar20._16_4_ = fVar146;
    fVar148 = fVar150 * auVar160._20_4_ * 3.0;
    auVar20._20_4_ = fVar148;
    fVar150 = fVar150 * auVar160._24_4_ * 3.0;
    auVar20._24_4_ = fVar150;
    auVar20._28_4_ = auVar165._28_4_;
    auVar179 = ZEXT1632(auVar119);
    auVar181 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar119));
    auVar17 = vpermps_avx2(_DAT_01fec480,auVar99);
    _local_a60 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar192));
    auVar12 = vsubps_avx(auVar181,auVar179);
    auVar182 = vsubps_avx(_local_a60,ZEXT1632(auVar192));
    fVar118 = auVar182._0_4_;
    fVar141 = auVar182._4_4_;
    auVar233._4_4_ = local_9c0._4_4_ * fVar141;
    auVar233._0_4_ = local_9c0._0_4_ * fVar118;
    fVar143 = auVar182._8_4_;
    auVar233._8_4_ = local_9c0._8_4_ * fVar143;
    fVar145 = auVar182._12_4_;
    auVar233._12_4_ = local_9c0._12_4_ * fVar145;
    fVar147 = auVar182._16_4_;
    auVar233._16_4_ = local_9c0._16_4_ * fVar147;
    fVar149 = auVar182._20_4_;
    auVar233._20_4_ = local_9c0._20_4_ * fVar149;
    fVar151 = auVar182._24_4_;
    auVar233._24_4_ = local_9c0._24_4_ * fVar151;
    auVar233._28_4_ = auVar181._28_4_;
    auVar8 = vfmsub231ps_fma(auVar233,auVar246,auVar12);
    auVar13 = vsubps_avx(auVar17,auVar99);
    fVar242 = auVar12._0_4_;
    fVar252 = auVar12._4_4_;
    auVar260._4_4_ = fVar252 * local_9e0._4_4_;
    auVar260._0_4_ = fVar242 * (float)local_9e0._0_4_;
    fVar253 = auVar12._8_4_;
    auVar260._8_4_ = fVar253 * local_9e0._8_4_;
    fVar254 = auVar12._12_4_;
    auVar260._12_4_ = fVar254 * local_9e0._12_4_;
    fVar255 = auVar12._16_4_;
    auVar260._16_4_ = fVar255 * local_9e0._16_4_;
    fVar256 = auVar12._20_4_;
    auVar260._20_4_ = fVar256 * local_9e0._20_4_;
    fVar257 = auVar12._24_4_;
    auVar260._24_4_ = fVar257 * local_9e0._24_4_;
    auVar260._28_4_ = auVar17._28_4_;
    auVar152 = vfmsub231ps_fma(auVar260,local_9c0,auVar13);
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar152._12_4_ * auVar152._12_4_,
                                                CONCAT48(auVar152._8_4_ * auVar152._8_4_,
                                                         CONCAT44(auVar152._4_4_ * auVar152._4_4_,
                                                                  auVar152._0_4_ * auVar152._0_4_)))
                                     ),ZEXT1632(auVar8),ZEXT1632(auVar8));
    fVar187 = auVar13._0_4_;
    fVar188 = auVar13._4_4_;
    auVar276._4_4_ = fVar188 * auVar246._4_4_;
    auVar276._0_4_ = fVar187 * auVar246._0_4_;
    fVar189 = auVar13._8_4_;
    auVar276._8_4_ = fVar189 * auVar246._8_4_;
    fVar190 = auVar13._12_4_;
    auVar276._12_4_ = fVar190 * auVar246._12_4_;
    fVar191 = auVar13._16_4_;
    auVar276._16_4_ = fVar191 * auVar246._16_4_;
    fVar263 = auVar13._20_4_;
    auVar276._20_4_ = fVar263 * auVar246._20_4_;
    fVar264 = auVar13._24_4_;
    auVar276._24_4_ = fVar264 * auVar246._24_4_;
    auVar276._28_4_ = local_a60._28_4_;
    auVar120 = vfmsub231ps_fma(auVar276,local_9e0,auVar182);
    auVar159._0_4_ = fVar118 * fVar118;
    auVar159._4_4_ = fVar141 * fVar141;
    auVar159._8_4_ = fVar143 * fVar143;
    auVar159._12_4_ = fVar145 * fVar145;
    auVar159._16_4_ = fVar147 * fVar147;
    auVar159._20_4_ = fVar149 * fVar149;
    auVar159._24_4_ = fVar151 * fVar151;
    auVar159._28_4_ = 0;
    auVar152 = vfmadd231ps_fma(auVar159,auVar13,auVar13);
    auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar12,auVar12);
    auVar97 = vrcpps_avx(ZEXT1632(auVar152));
    auVar120 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar120),ZEXT1632(auVar120));
    auVar269._8_4_ = 0x3f800000;
    auVar269._0_8_ = 0x3f8000003f800000;
    auVar269._12_4_ = 0x3f800000;
    auVar269._16_4_ = 0x3f800000;
    auVar269._20_4_ = 0x3f800000;
    auVar269._24_4_ = 0x3f800000;
    auVar269._28_4_ = 0x3f800000;
    auVar8 = vfnmadd213ps_fma(auVar97,ZEXT1632(auVar152),auVar269);
    auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar97,auVar97);
    auVar18 = vpermps_avx2(_DAT_01fec480,local_9c0);
    local_a80 = vpermps_avx2(_DAT_01fec480,auVar246);
    auVar277._4_4_ = auVar18._4_4_ * fVar141;
    auVar277._0_4_ = auVar18._0_4_ * fVar118;
    auVar277._8_4_ = auVar18._8_4_ * fVar143;
    auVar277._12_4_ = auVar18._12_4_ * fVar145;
    auVar277._16_4_ = auVar18._16_4_ * fVar147;
    auVar277._20_4_ = auVar18._20_4_ * fVar149;
    auVar277._24_4_ = auVar18._24_4_ * fVar151;
    auVar277._28_4_ = auVar97._28_4_;
    auVar84 = vfmsub231ps_fma(auVar277,local_a80,auVar12);
    local_aa0 = vpermps_avx2(_DAT_01fec480,local_9e0);
    auVar10._4_4_ = fVar252 * local_aa0._4_4_;
    auVar10._0_4_ = fVar242 * local_aa0._0_4_;
    auVar10._8_4_ = fVar253 * local_aa0._8_4_;
    auVar10._12_4_ = fVar254 * local_aa0._12_4_;
    auVar10._16_4_ = fVar255 * local_aa0._16_4_;
    auVar10._20_4_ = fVar256 * local_aa0._20_4_;
    auVar10._24_4_ = fVar257 * local_aa0._24_4_;
    auVar10._28_4_ = 0;
    auVar93 = vfmsub231ps_fma(auVar10,auVar18,auVar13);
    auVar84 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar93._12_4_ * auVar93._12_4_,
                                                 CONCAT48(auVar93._8_4_ * auVar93._8_4_,
                                                          CONCAT44(auVar93._4_4_ * auVar93._4_4_,
                                                                   auVar93._0_4_ * auVar93._0_4_))))
                              ,ZEXT1632(auVar84),ZEXT1632(auVar84));
    auVar219._0_4_ = fVar187 * local_a80._0_4_;
    auVar219._4_4_ = fVar188 * local_a80._4_4_;
    auVar219._8_4_ = fVar189 * local_a80._8_4_;
    auVar219._12_4_ = fVar190 * local_a80._12_4_;
    auVar219._16_4_ = fVar191 * local_a80._16_4_;
    auVar219._20_4_ = fVar263 * local_a80._20_4_;
    auVar219._24_4_ = fVar264 * local_a80._24_4_;
    auVar219._28_4_ = 0;
    auVar93 = vfmsub231ps_fma(auVar219,local_aa0,auVar182);
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),ZEXT1632(auVar93),ZEXT1632(auVar93));
    auVar97 = vmaxps_avx(ZEXT1632(CONCAT412(auVar120._12_4_ * auVar8._12_4_,
                                            CONCAT48(auVar120._8_4_ * auVar8._8_4_,
                                                     CONCAT44(auVar120._4_4_ * auVar8._4_4_,
                                                              auVar120._0_4_ * auVar8._0_4_)))),
                         ZEXT1632(CONCAT412(auVar84._12_4_ * auVar8._12_4_,
                                            CONCAT48(auVar84._8_4_ * auVar8._8_4_,
                                                     CONCAT44(auVar84._4_4_ * auVar8._4_4_,
                                                              auVar84._0_4_ * auVar8._0_4_)))));
    auVar180._0_4_ = auVar211._0_4_ + fVar117;
    auVar180._4_4_ = auVar211._4_4_ + fVar140;
    auVar180._8_4_ = auVar211._8_4_ + fVar142;
    auVar180._12_4_ = auVar211._12_4_ + fVar144;
    auVar180._16_4_ = fVar146 + 0.0;
    auVar180._20_4_ = fVar148 + 0.0;
    auVar180._24_4_ = fVar150 + 0.0;
    auVar180._28_4_ = auVar165._28_4_ + 0.0;
    auStack_870 = auVar180._16_16_;
    local_860 = ZEXT1632(auVar211);
    auVar165 = vsubps_avx(local_860,auVar20);
    auVar19 = vpermps_avx2(_DAT_01fec480,auVar165);
    auVar20 = vpermps_avx2(_DAT_01fec480,local_860);
    auVar165 = vmaxps_avx(local_860,auVar180);
    auVar98 = vmaxps_avx(auVar19,auVar20);
    auVar160 = vrsqrtps_avx(ZEXT1632(auVar152));
    auVar165 = vmaxps_avx(auVar165,auVar98);
    fVar117 = auVar160._0_4_;
    fVar140 = auVar160._4_4_;
    fVar150 = auVar160._8_4_;
    fVar142 = auVar160._12_4_;
    fVar144 = auVar160._16_4_;
    fVar146 = auVar160._20_4_;
    fVar148 = auVar160._24_4_;
    auVar11._4_4_ = fVar140 * fVar140 * fVar140 * auVar152._4_4_ * -0.5;
    auVar11._0_4_ = fVar117 * fVar117 * fVar117 * auVar152._0_4_ * -0.5;
    auVar11._8_4_ = fVar150 * fVar150 * fVar150 * auVar152._8_4_ * -0.5;
    auVar11._12_4_ = fVar142 * fVar142 * fVar142 * auVar152._12_4_ * -0.5;
    auVar11._16_4_ = fVar144 * fVar144 * fVar144 * -0.0;
    auVar11._20_4_ = fVar146 * fVar146 * fVar146 * -0.0;
    auVar11._24_4_ = fVar148 * fVar148 * fVar148 * -0.0;
    auVar11._28_4_ = local_aa0._28_4_;
    auVar100._8_4_ = 0x3fc00000;
    auVar100._0_8_ = 0x3fc000003fc00000;
    auVar100._12_4_ = 0x3fc00000;
    auVar100._16_4_ = 0x3fc00000;
    auVar100._20_4_ = 0x3fc00000;
    auVar100._24_4_ = 0x3fc00000;
    auVar100._28_4_ = 0x3fc00000;
    auVar8 = vfmadd231ps_fma(auVar11,auVar100,auVar160);
    fVar117 = auVar8._0_4_;
    fVar140 = auVar8._4_4_;
    auVar24._4_4_ = fVar188 * fVar140;
    auVar24._0_4_ = fVar187 * fVar117;
    fVar150 = auVar8._8_4_;
    auVar24._8_4_ = fVar189 * fVar150;
    fVar142 = auVar8._12_4_;
    auVar24._12_4_ = fVar190 * fVar142;
    auVar24._16_4_ = fVar191 * 0.0;
    auVar24._20_4_ = fVar263 * 0.0;
    uVar81 = auVar160._28_4_;
    auVar24._24_4_ = fVar264 * 0.0;
    auVar24._28_4_ = uVar81;
    auVar228._0_4_ = (float)local_a20._0_4_ * fVar117 * fVar118;
    auVar228._4_4_ = (float)local_a20._4_4_ * fVar140 * fVar141;
    auVar228._8_4_ = fStack_a18 * fVar150 * fVar143;
    auVar228._12_4_ = fStack_a14 * fVar142 * fVar145;
    auVar228._16_4_ = fStack_a10 * fVar147 * 0.0;
    auVar228._20_4_ = fStack_a0c * fVar149 * 0.0;
    auVar228._24_4_ = fStack_a08 * fVar151 * 0.0;
    auVar228._28_4_ = 0;
    auVar152 = vfmadd231ps_fma(auVar228,auVar24,_local_ae0);
    auVar276 = ZEXT1632(auVar192);
    auVar160 = vsubps_avx(ZEXT832(0) << 0x20,auVar276);
    fVar146 = auVar160._0_4_;
    fVar148 = auVar160._4_4_;
    auVar25._4_4_ = fVar148 * fVar140 * fVar141;
    auVar25._0_4_ = fVar146 * fVar117 * fVar118;
    fVar187 = auVar160._8_4_;
    auVar25._8_4_ = fVar187 * fVar150 * fVar143;
    fVar188 = auVar160._12_4_;
    auVar25._12_4_ = fVar188 * fVar142 * fVar145;
    fVar189 = auVar160._16_4_;
    auVar25._16_4_ = fVar189 * fVar147 * 0.0;
    fVar190 = auVar160._20_4_;
    auVar25._20_4_ = fVar190 * fVar149 * 0.0;
    fVar191 = auVar160._24_4_;
    auVar25._24_4_ = fVar191 * fVar151 * 0.0;
    auVar25._28_4_ = auVar13._28_4_;
    auVar14 = vsubps_avx(ZEXT832(0) << 0x20,auVar99);
    auVar120 = vfmadd231ps_fma(auVar25,auVar14,auVar24);
    auVar26._4_4_ = fVar252 * fVar140;
    auVar26._0_4_ = fVar242 * fVar117;
    auVar26._8_4_ = fVar253 * fVar150;
    auVar26._12_4_ = fVar254 * fVar142;
    auVar26._16_4_ = fVar255 * 0.0;
    auVar26._20_4_ = fVar256 * 0.0;
    auVar26._24_4_ = fVar257 * 0.0;
    auVar26._28_4_ = uVar81;
    auVar152 = vfmadd231ps_fma(ZEXT1632(auVar152),auVar26,_local_8a0);
    auVar233 = ZEXT832(0) << 0x20;
    auVar207 = vsubps_avx(auVar233,auVar179);
    auVar120 = vfmadd231ps_fma(ZEXT1632(auVar120),auVar207,auVar26);
    auVar261 = ZEXT1664(auVar120);
    auVar27._4_4_ = (float)local_a20._4_4_ * fVar148;
    auVar27._0_4_ = (float)local_a20._0_4_ * fVar146;
    auVar27._8_4_ = fStack_a18 * fVar187;
    auVar27._12_4_ = fStack_a14 * fVar188;
    auVar27._16_4_ = fStack_a10 * fVar189;
    auVar27._20_4_ = fStack_a0c * fVar190;
    auVar27._24_4_ = fStack_a08 * fVar191;
    auVar27._28_4_ = uVar81;
    auVar84 = vfmadd231ps_fma(auVar27,_local_ae0,auVar14);
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),_local_8a0,auVar207);
    fVar118 = auVar120._0_4_;
    fVar242 = auVar152._0_4_;
    fVar141 = auVar120._4_4_;
    fVar252 = auVar152._4_4_;
    fVar143 = auVar120._8_4_;
    fVar253 = auVar152._8_4_;
    fVar145 = auVar120._12_4_;
    fVar254 = auVar152._12_4_;
    auVar28._28_4_ = local_8a0._28_4_;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(fVar254 * fVar145,
                            CONCAT48(fVar253 * fVar143,CONCAT44(fVar252 * fVar141,fVar242 * fVar118)
                                    )));
    auVar15 = vsubps_avx(ZEXT1632(auVar84),auVar28);
    auVar29._4_4_ = fVar148 * fVar148;
    auVar29._0_4_ = fVar146 * fVar146;
    auVar29._8_4_ = fVar187 * fVar187;
    auVar29._12_4_ = fVar188 * fVar188;
    auVar29._16_4_ = fVar189 * fVar189;
    auVar29._20_4_ = fVar190 * fVar190;
    auVar29._24_4_ = fVar191 * fVar191;
    auVar29._28_4_ = local_8a0._28_4_;
    auVar84 = vfmadd231ps_fma(auVar29,auVar14,auVar14);
    auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar207,auVar207);
    auVar30._28_4_ = auVar12._28_4_;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(fVar145 * fVar145,
                            CONCAT48(fVar143 * fVar143,CONCAT44(fVar141 * fVar141,fVar118 * fVar118)
                                    )));
    auVar16 = vsubps_avx(ZEXT1632(auVar84),auVar30);
    auVar98 = vsqrtps_avx(auVar97);
    fVar144 = auVar98._28_4_ + auVar165._28_4_;
    fVar118 = (auVar98._0_4_ + auVar165._0_4_) * 1.0000002;
    fVar141 = (auVar98._4_4_ + auVar165._4_4_) * 1.0000002;
    fVar143 = (auVar98._8_4_ + auVar165._8_4_) * 1.0000002;
    fVar145 = (auVar98._12_4_ + auVar165._12_4_) * 1.0000002;
    fVar147 = (auVar98._16_4_ + auVar165._16_4_) * 1.0000002;
    fVar149 = (auVar98._20_4_ + auVar165._20_4_) * 1.0000002;
    fVar151 = (auVar98._24_4_ + auVar165._24_4_) * 1.0000002;
    auVar31._4_4_ = fVar141 * fVar141;
    auVar31._0_4_ = fVar118 * fVar118;
    auVar31._8_4_ = fVar143 * fVar143;
    auVar31._12_4_ = fVar145 * fVar145;
    auVar31._16_4_ = fVar147 * fVar147;
    auVar31._20_4_ = fVar149 * fVar149;
    auVar31._24_4_ = fVar151 * fVar151;
    auVar31._28_4_ = fVar144;
    local_2e0._0_4_ = auVar15._0_4_ + auVar15._0_4_;
    local_2e0._4_4_ = auVar15._4_4_ + auVar15._4_4_;
    local_2e0._8_4_ = auVar15._8_4_ + auVar15._8_4_;
    local_2e0._12_4_ = auVar15._12_4_ + auVar15._12_4_;
    local_2e0._16_4_ = auVar15._16_4_ + auVar15._16_4_;
    local_2e0._20_4_ = auVar15._20_4_ + auVar15._20_4_;
    local_2e0._24_4_ = auVar15._24_4_ + auVar15._24_4_;
    fVar118 = auVar15._28_4_;
    local_2e0._28_4_ = fVar118 + fVar118;
    auVar165 = vsubps_avx(auVar16,auVar31);
    auVar277 = ZEXT1632(auVar152);
    local_a00._28_4_ = fVar118;
    local_a00._0_28_ =
         ZEXT1628(CONCAT412(fVar254 * fVar254,
                            CONCAT48(fVar253 * fVar253,CONCAT44(fVar252 * fVar252,fVar242 * fVar242)
                                    )));
    local_680 = vsubps_avx(local_2c0,local_a00);
    auVar32._4_4_ = local_2e0._4_4_ * local_2e0._4_4_;
    auVar32._0_4_ = local_2e0._0_4_ * local_2e0._0_4_;
    auVar32._8_4_ = local_2e0._8_4_ * local_2e0._8_4_;
    auVar32._12_4_ = local_2e0._12_4_ * local_2e0._12_4_;
    auVar32._16_4_ = local_2e0._16_4_ * local_2e0._16_4_;
    auVar32._20_4_ = local_2e0._20_4_ * local_2e0._20_4_;
    auVar32._24_4_ = local_2e0._24_4_ * local_2e0._24_4_;
    auVar32._28_4_ = auVar97._28_4_;
    fVar141 = local_680._0_4_;
    fVar143 = local_680._4_4_;
    fVar145 = local_680._8_4_;
    fVar147 = local_680._12_4_;
    fVar149 = local_680._16_4_;
    fVar151 = local_680._20_4_;
    fVar242 = local_680._24_4_;
    auVar33._4_4_ = auVar165._4_4_ * fVar143 * 4.0;
    auVar33._0_4_ = auVar165._0_4_ * fVar141 * 4.0;
    auVar33._8_4_ = auVar165._8_4_ * fVar145 * 4.0;
    auVar33._12_4_ = auVar165._12_4_ * fVar147 * 4.0;
    auVar33._16_4_ = auVar165._16_4_ * fVar149 * 4.0;
    auVar33._20_4_ = auVar165._20_4_ * fVar151 * 4.0;
    auVar33._24_4_ = auVar165._24_4_ * fVar242 * 4.0;
    auVar33._28_4_ = fVar144;
    auVar15 = vsubps_avx(auVar32,auVar33);
    auVar97 = vcmpps_avx(auVar15,auVar233,5);
    auVar260 = ZEXT1632(auVar120);
    fVar118 = local_680._28_4_;
    if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar97 >> 0x7f,0) == '\0') &&
          (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar97 >> 0xbf,0) == '\0') &&
        (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar97[0x1f]) {
      auVar247._8_4_ = 0x7f800000;
      auVar247._0_8_ = 0x7f8000007f800000;
      auVar247._12_4_ = 0x7f800000;
      auVar247._16_4_ = 0x7f800000;
      auVar247._20_4_ = 0x7f800000;
      auVar247._24_4_ = 0x7f800000;
      auVar247._28_4_ = 0x7f800000;
      auVar203._8_4_ = 0xff800000;
      auVar203._0_8_ = 0xff800000ff800000;
      auVar203._12_4_ = 0xff800000;
      auVar203._16_4_ = 0xff800000;
      auVar203._20_4_ = 0xff800000;
      auVar203._24_4_ = 0xff800000;
      auVar203._28_4_ = 0xff800000;
    }
    else {
      auVar11 = vsqrtps_avx(auVar15);
      auVar101._0_4_ = fVar141 + fVar141;
      auVar101._4_4_ = fVar143 + fVar143;
      auVar101._8_4_ = fVar145 + fVar145;
      auVar101._12_4_ = fVar147 + fVar147;
      auVar101._16_4_ = fVar149 + fVar149;
      auVar101._20_4_ = fVar151 + fVar151;
      auVar101._24_4_ = fVar242 + fVar242;
      auVar101._28_4_ = fVar118 + fVar118;
      auVar10 = vrcpps_avx(auVar101);
      auVar233 = vcmpps_avx(auVar15,auVar233,5);
      auVar204._8_4_ = 0x3f800000;
      auVar204._0_8_ = 0x3f8000003f800000;
      auVar204._12_4_ = 0x3f800000;
      auVar204._16_4_ = 0x3f800000;
      auVar204._20_4_ = 0x3f800000;
      auVar204._24_4_ = 0x3f800000;
      auVar204._28_4_ = 0x3f800000;
      auVar152 = vfnmadd213ps_fma(auVar101,auVar10,auVar204);
      auVar152 = vfmadd132ps_fma(ZEXT1632(auVar152),auVar10,auVar10);
      auVar205._0_4_ = (uint)local_2e0._0_4_ ^ local_7e0;
      auVar205._4_4_ = (uint)local_2e0._4_4_ ^ uStack_7dc;
      auVar205._8_4_ = (uint)local_2e0._8_4_ ^ uStack_7d8;
      auVar205._12_4_ = (uint)local_2e0._12_4_ ^ uStack_7d4;
      auVar205._16_4_ = (uint)local_2e0._16_4_ ^ (uint)fStack_7d0;
      auVar205._20_4_ = (uint)local_2e0._20_4_ ^ (uint)fStack_7cc;
      auVar205._24_4_ = (uint)local_2e0._24_4_ ^ (uint)fStack_7c8;
      auVar205._28_4_ = (uint)local_2e0._28_4_ ^ uStack_7c4;
      auVar10 = vsubps_avx(auVar205,auVar11);
      auVar34._4_4_ = auVar10._4_4_ * auVar152._4_4_;
      auVar34._0_4_ = auVar10._0_4_ * auVar152._0_4_;
      auVar34._8_4_ = auVar10._8_4_ * auVar152._8_4_;
      auVar34._12_4_ = auVar10._12_4_ * auVar152._12_4_;
      auVar34._16_4_ = auVar10._16_4_ * 0.0;
      auVar34._20_4_ = auVar10._20_4_ * 0.0;
      auVar34._24_4_ = auVar10._24_4_ * 0.0;
      auVar34._28_4_ = auVar10._28_4_;
      auVar15 = vsubps_avx(auVar11,local_2e0);
      auVar102._0_4_ = auVar15._0_4_ * auVar152._0_4_;
      auVar102._4_4_ = auVar15._4_4_ * auVar152._4_4_;
      auVar102._8_4_ = auVar15._8_4_ * auVar152._8_4_;
      auVar102._12_4_ = auVar15._12_4_ * auVar152._12_4_;
      auVar102._16_4_ = auVar15._16_4_ * 0.0;
      auVar102._20_4_ = auVar15._20_4_ * 0.0;
      auVar102._24_4_ = auVar15._24_4_ * 0.0;
      auVar102._28_4_ = 0;
      auVar152 = vfmadd213ps_fma(auVar277,auVar34,auVar260);
      local_3a0 = ZEXT1632(CONCAT412(fVar142 * auVar152._12_4_,
                                     CONCAT48(fVar150 * auVar152._8_4_,
                                              CONCAT44(fVar140 * auVar152._4_4_,
                                                       fVar117 * auVar152._0_4_))));
      auVar58._4_4_ = uStack_8bc;
      auVar58._0_4_ = local_8c0;
      auVar58._8_4_ = uStack_8b8;
      auVar58._12_4_ = uStack_8b4;
      auVar58._16_4_ = uStack_8b0;
      auVar58._20_4_ = uStack_8ac;
      auVar58._24_4_ = uStack_8a8;
      auVar58._28_4_ = uStack_8a4;
      auVar15 = vandps_avx(local_a00,auVar58);
      auVar15 = vmaxps_avx(local_620,auVar15);
      auVar35._4_4_ = auVar15._4_4_ * 1.9073486e-06;
      auVar35._0_4_ = auVar15._0_4_ * 1.9073486e-06;
      auVar35._8_4_ = auVar15._8_4_ * 1.9073486e-06;
      auVar35._12_4_ = auVar15._12_4_ * 1.9073486e-06;
      auVar35._16_4_ = auVar15._16_4_ * 1.9073486e-06;
      auVar35._20_4_ = auVar15._20_4_ * 1.9073486e-06;
      auVar35._24_4_ = auVar15._24_4_ * 1.9073486e-06;
      auVar35._28_4_ = auVar15._28_4_;
      auVar15 = vandps_avx(local_680,auVar58);
      auVar15 = vcmpps_avx(auVar15,auVar35,1);
      auVar152 = vfmadd213ps_fma(auVar277,auVar102,auVar260);
      auVar234._8_4_ = 0x7f800000;
      auVar234._0_8_ = 0x7f8000007f800000;
      auVar234._12_4_ = 0x7f800000;
      auVar234._16_4_ = 0x7f800000;
      auVar234._20_4_ = 0x7f800000;
      auVar234._24_4_ = 0x7f800000;
      auVar234._28_4_ = 0x7f800000;
      auVar247 = vblendvps_avx(auVar234,auVar34,auVar233);
      local_3c0 = fVar117 * auVar152._0_4_;
      fStack_3bc = fVar140 * auVar152._4_4_;
      fStack_3b8 = fVar150 * auVar152._8_4_;
      fStack_3b4 = fVar142 * auVar152._12_4_;
      uStack_3b0 = 0;
      uStack_3ac = 0;
      uStack_3a8 = 0;
      uStack_3a4 = auVar10._28_4_;
      auVar206._8_4_ = 0xff800000;
      auVar206._0_8_ = 0xff800000ff800000;
      auVar206._12_4_ = 0xff800000;
      auVar206._16_4_ = 0xff800000;
      auVar206._20_4_ = 0xff800000;
      auVar206._24_4_ = 0xff800000;
      auVar206._28_4_ = 0xff800000;
      auVar203 = vblendvps_avx(auVar206,auVar102,auVar233);
      auVar10 = auVar233 & auVar15;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar97 = vandps_avx(auVar15,auVar233);
        auVar15 = vcmpps_avx(auVar165,_DAT_01faff00,2);
        auVar235._8_4_ = 0xff800000;
        auVar235._0_8_ = 0xff800000ff800000;
        auVar235._12_4_ = 0xff800000;
        auVar235._16_4_ = 0xff800000;
        auVar235._20_4_ = 0xff800000;
        auVar235._24_4_ = 0xff800000;
        auVar235._28_4_ = 0xff800000;
        auVar275._8_4_ = 0x7f800000;
        auVar275._0_8_ = 0x7f8000007f800000;
        auVar275._12_4_ = 0x7f800000;
        auVar275._16_4_ = 0x7f800000;
        auVar275._20_4_ = 0x7f800000;
        auVar275._24_4_ = 0x7f800000;
        auVar275._28_4_ = 0x7f800000;
        auVar165 = vblendvps_avx(auVar275,auVar235,auVar15);
        auVar152 = vpackssdw_avx(auVar97._0_16_,auVar97._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar152);
        auVar247 = vblendvps_avx(auVar247,auVar165,auVar10);
        auVar165 = vblendvps_avx(auVar235,auVar275,auVar15);
        auVar203 = vblendvps_avx(auVar203,auVar165,auVar10);
        auVar112._0_8_ = auVar97._0_8_ ^ 0xffffffffffffffff;
        auVar112._8_4_ = auVar97._8_4_ ^ 0xffffffff;
        auVar112._12_4_ = auVar97._12_4_ ^ 0xffffffff;
        auVar112._16_4_ = auVar97._16_4_ ^ 0xffffffff;
        auVar112._20_4_ = auVar97._20_4_ ^ 0xffffffff;
        auVar112._24_4_ = auVar97._24_4_ ^ 0xffffffff;
        auVar112._28_4_ = auVar97._28_4_ ^ 0xffffffff;
        auVar97 = vorps_avx(auVar15,auVar112);
        auVar97 = vandps_avx(auVar233,auVar97);
      }
    }
    auVar165 = local_5e0 & auVar97;
    if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar165 >> 0x7f,0) != '\0') ||
          (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar165 >> 0xbf,0) != '\0') ||
        (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar165[0x1f] < '\0') {
      local_3e0 = ZEXT1632(auVar8);
      fVar144 = *(float *)(ray + k * 4 + 0x100);
      local_6d0 = ZEXT416((uint)fVar144);
      fVar252 = fVar144 - (float)local_940._0_4_;
      auVar103._4_4_ = fVar252;
      auVar103._0_4_ = fVar252;
      auVar103._8_4_ = fVar252;
      auVar103._12_4_ = fVar252;
      auVar103._16_4_ = fVar252;
      auVar103._20_4_ = fVar252;
      auVar103._24_4_ = fVar252;
      auVar103._28_4_ = fVar252;
      auVar15 = vminps_avx(auVar103,auVar203);
      auVar36._4_4_ = fVar148 * auVar246._4_4_;
      auVar36._0_4_ = fVar146 * auVar246._0_4_;
      auVar36._8_4_ = fVar187 * auVar246._8_4_;
      auVar36._12_4_ = fVar188 * auVar246._12_4_;
      auVar36._16_4_ = fVar189 * auVar246._16_4_;
      auVar36._20_4_ = fVar190 * auVar246._20_4_;
      auVar36._24_4_ = fVar191 * auVar246._24_4_;
      auVar36._28_4_ = auVar160._28_4_;
      auVar8 = vfmadd213ps_fma(auVar14,local_9e0,auVar36);
      auVar64._4_4_ = fStack_37c;
      auVar64._0_4_ = local_380;
      auVar64._8_4_ = fStack_378;
      auVar64._12_4_ = fStack_374;
      auVar64._16_4_ = fStack_370;
      auVar64._20_4_ = fStack_36c;
      auVar64._24_4_ = fStack_368;
      auVar64._28_4_ = fStack_364;
      auVar14 = vmaxps_avx(auVar64,auVar247);
      auVar152 = vfmadd213ps_fma(auVar207,local_9c0,ZEXT1632(auVar8));
      auVar37._4_4_ = (float)local_a20._4_4_ * auVar246._4_4_;
      auVar37._0_4_ = (float)local_a20._0_4_ * auVar246._0_4_;
      auVar37._8_4_ = fStack_a18 * auVar246._8_4_;
      auVar37._12_4_ = fStack_a14 * auVar246._12_4_;
      auVar37._16_4_ = fStack_a10 * auVar246._16_4_;
      auVar37._20_4_ = fStack_a0c * auVar246._20_4_;
      auVar37._24_4_ = fStack_a08 * auVar246._24_4_;
      auVar37._28_4_ = 0;
      auVar8 = vfmadd231ps_fma(auVar37,_local_ae0,local_9e0);
      auVar120 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_8a0,local_9c0);
      auVar59._4_4_ = uStack_8bc;
      auVar59._0_4_ = local_8c0;
      auVar59._8_4_ = uStack_8b8;
      auVar59._12_4_ = uStack_8b4;
      auVar59._16_4_ = uStack_8b0;
      auVar59._20_4_ = uStack_8ac;
      auVar59._24_4_ = uStack_8a8;
      auVar59._28_4_ = uStack_8a4;
      auVar165 = vandps_avx(auVar59,ZEXT1632(auVar120));
      auVar104._8_4_ = 0x219392ef;
      auVar104._0_8_ = 0x219392ef219392ef;
      auVar104._12_4_ = 0x219392ef;
      auVar104._16_4_ = 0x219392ef;
      auVar104._20_4_ = 0x219392ef;
      auVar104._24_4_ = 0x219392ef;
      auVar104._28_4_ = 0x219392ef;
      auVar160 = vcmpps_avx(auVar165,auVar104,1);
      auVar165 = vrcpps_avx(ZEXT1632(auVar120));
      auVar270._8_4_ = 0x3f800000;
      auVar270._0_8_ = 0x3f8000003f800000;
      auVar270._12_4_ = 0x3f800000;
      auVar270._16_4_ = 0x3f800000;
      auVar270._20_4_ = 0x3f800000;
      auVar270._24_4_ = 0x3f800000;
      auVar270._28_4_ = 0x3f800000;
      auVar207 = ZEXT1632(auVar120);
      auVar8 = vfnmadd213ps_fma(auVar165,auVar207,auVar270);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar165,auVar165);
      auVar267._0_4_ = auVar120._0_4_ ^ local_7e0;
      auVar267._4_4_ = auVar120._4_4_ ^ uStack_7dc;
      auVar267._8_4_ = auVar120._8_4_ ^ uStack_7d8;
      auVar267._12_4_ = auVar120._12_4_ ^ uStack_7d4;
      auVar267._16_4_ = fStack_7d0;
      auVar267._20_4_ = fStack_7cc;
      auVar267._24_4_ = fStack_7c8;
      auVar267._28_4_ = uStack_7c4;
      auVar38._4_4_ = auVar8._4_4_ * (float)(auVar152._4_4_ ^ uStack_7dc);
      auVar38._0_4_ = auVar8._0_4_ * (float)(auVar152._0_4_ ^ local_7e0);
      auVar38._8_4_ = auVar8._8_4_ * (float)(auVar152._8_4_ ^ uStack_7d8);
      auVar38._12_4_ = auVar8._12_4_ * (float)(auVar152._12_4_ ^ uStack_7d4);
      auVar38._16_4_ = fStack_7d0 * 0.0;
      auVar38._20_4_ = fStack_7cc * 0.0;
      auVar38._24_4_ = fStack_7c8 * 0.0;
      auVar38._28_4_ = uStack_7c4;
      auVar165 = vcmpps_avx(auVar207,auVar267,1);
      auVar165 = vorps_avx(auVar160,auVar165);
      auVar271._8_4_ = 0xff800000;
      auVar271._0_8_ = 0xff800000ff800000;
      auVar271._12_4_ = 0xff800000;
      auVar271._16_4_ = 0xff800000;
      auVar271._20_4_ = 0xff800000;
      auVar271._24_4_ = 0xff800000;
      auVar271._28_4_ = 0xff800000;
      auVar165 = vblendvps_avx(auVar38,auVar271,auVar165);
      auVar14 = vmaxps_avx(auVar14,auVar165);
      auVar165 = vcmpps_avx(auVar207,auVar267,6);
      auVar165 = vorps_avx(auVar160,auVar165);
      auVar208._8_4_ = 0x7f800000;
      auVar208._0_8_ = 0x7f8000007f800000;
      auVar208._12_4_ = 0x7f800000;
      auVar208._16_4_ = 0x7f800000;
      auVar208._20_4_ = 0x7f800000;
      auVar208._24_4_ = 0x7f800000;
      auVar208._28_4_ = 0x7f800000;
      auVar165 = vblendvps_avx(auVar38,auVar208,auVar165);
      auVar207 = vminps_avx(auVar15,auVar165);
      fVar146 = (float)(local_7e0 ^ (uint)local_a80._0_4_);
      fVar148 = (float)(uStack_7dc ^ (uint)local_a80._4_4_);
      fVar187 = (float)(uStack_7d8 ^ (uint)local_a80._8_4_);
      fVar188 = (float)(uStack_7d4 ^ (uint)local_a80._12_4_);
      fVar189 = (float)((uint)fStack_7d0 ^ (uint)local_a80._16_4_);
      fVar190 = (float)((uint)fStack_7cc ^ (uint)local_a80._20_4_);
      fVar191 = (float)((uint)fStack_7c8 ^ (uint)local_a80._24_4_);
      auVar209._0_4_ = local_7e0 ^ (uint)local_aa0._0_4_;
      auVar209._4_4_ = uStack_7dc ^ (uint)local_aa0._4_4_;
      auVar209._8_4_ = uStack_7d8 ^ (uint)local_aa0._8_4_;
      auVar209._12_4_ = uStack_7d4 ^ (uint)local_aa0._12_4_;
      auVar209._16_4_ = (uint)fStack_7d0 ^ (uint)local_aa0._16_4_;
      auVar209._20_4_ = (uint)fStack_7cc ^ (uint)local_aa0._20_4_;
      auVar209._24_4_ = (uint)fStack_7c8 ^ (uint)local_aa0._24_4_;
      auVar209._28_4_ = uStack_7c4 ^ local_aa0._28_4_;
      auVar165 = vsubps_avx(ZEXT832(0) << 0x20,auVar17);
      auVar160 = vsubps_avx(ZEXT832(0) << 0x20,_local_a60);
      auVar39._4_4_ = auVar160._4_4_ * fVar148;
      auVar39._0_4_ = auVar160._0_4_ * fVar146;
      auVar39._8_4_ = auVar160._8_4_ * fVar187;
      auVar39._12_4_ = auVar160._12_4_ * fVar188;
      auVar39._16_4_ = auVar160._16_4_ * fVar189;
      auVar39._20_4_ = auVar160._20_4_ * fVar190;
      auVar39._24_4_ = auVar160._24_4_ * fVar191;
      auVar39._28_4_ = auVar160._28_4_;
      auVar8 = vfmadd231ps_fma(auVar39,auVar209,auVar165);
      uStack_c04 = auVar18._28_4_;
      auVar220._0_4_ = local_7e0 ^ (uint)auVar18._0_4_;
      auVar220._4_4_ = uStack_7dc ^ (uint)auVar18._4_4_;
      auVar220._8_4_ = uStack_7d8 ^ (uint)auVar18._8_4_;
      auVar220._12_4_ = uStack_7d4 ^ (uint)auVar18._12_4_;
      auVar220._16_4_ = (uint)fStack_7d0 ^ (uint)auVar18._16_4_;
      auVar220._20_4_ = (uint)fStack_7cc ^ (uint)auVar18._20_4_;
      auVar220._24_4_ = (uint)fStack_7c8 ^ (uint)auVar18._24_4_;
      auVar220._28_4_ = uStack_7c4 ^ uStack_c04;
      auVar165 = vsubps_avx(ZEXT832(0) << 0x20,auVar181);
      auVar152 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar220,auVar165);
      auVar40._4_4_ = (float)local_a20._4_4_ * fVar148;
      auVar40._0_4_ = (float)local_a20._0_4_ * fVar146;
      auVar40._8_4_ = fStack_a18 * fVar187;
      auVar40._12_4_ = fStack_a14 * fVar188;
      auVar40._16_4_ = fStack_a10 * fVar189;
      auVar40._20_4_ = fStack_a0c * fVar190;
      auVar40._24_4_ = fStack_a08 * fVar191;
      auVar40._28_4_ = uStack_7c4 ^ local_a80._28_4_;
      auVar8 = vfmadd231ps_fma(auVar40,_local_ae0,auVar209);
      auVar120 = vfmadd231ps_fma(ZEXT1632(auVar8),_local_8a0,auVar220);
      auVar165 = vandps_avx(auVar59,ZEXT1632(auVar120));
      auVar15 = vrcpps_avx(ZEXT1632(auVar120));
      auVar251._8_4_ = 0x219392ef;
      auVar251._0_8_ = 0x219392ef219392ef;
      auVar251._12_4_ = 0x219392ef;
      auVar251._16_4_ = 0x219392ef;
      auVar251._20_4_ = 0x219392ef;
      auVar251._24_4_ = 0x219392ef;
      auVar251._28_4_ = 0x219392ef;
      auVar160 = vcmpps_avx(auVar165,auVar251,1);
      auVar240._8_4_ = 0x3f800000;
      auVar240._0_8_ = 0x3f8000003f800000;
      auVar240._12_4_ = 0x3f800000;
      auVar240._16_4_ = 0x3f800000;
      auVar240._20_4_ = 0x3f800000;
      auVar240._24_4_ = 0x3f800000;
      auVar240._28_4_ = 0x3f800000;
      auVar181 = ZEXT1632(auVar120);
      auVar8 = vfnmadd213ps_fma(auVar15,auVar181,auVar240);
      auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar15,auVar15);
      auVar221._0_4_ = auVar120._0_4_ ^ local_7e0;
      auVar221._4_4_ = auVar120._4_4_ ^ uStack_7dc;
      auVar221._8_4_ = auVar120._8_4_ ^ uStack_7d8;
      auVar221._12_4_ = auVar120._12_4_ ^ uStack_7d4;
      auVar221._16_4_ = fStack_7d0;
      auVar221._20_4_ = fStack_7cc;
      auVar221._24_4_ = fStack_7c8;
      auVar221._28_4_ = uStack_7c4;
      auVar41._4_4_ = auVar8._4_4_ * (float)(auVar152._4_4_ ^ uStack_7dc);
      auVar41._0_4_ = auVar8._0_4_ * (float)(auVar152._0_4_ ^ local_7e0);
      auVar41._8_4_ = auVar8._8_4_ * (float)(auVar152._8_4_ ^ uStack_7d8);
      auVar41._12_4_ = auVar8._12_4_ * (float)(auVar152._12_4_ ^ uStack_7d4);
      auVar41._16_4_ = fStack_7d0 * 0.0;
      auVar41._20_4_ = fStack_7cc * 0.0;
      auVar41._24_4_ = fStack_7c8 * 0.0;
      auVar41._28_4_ = uStack_7c4;
      auVar165 = vcmpps_avx(auVar181,auVar221,1);
      auVar165 = vorps_avx(auVar165,auVar160);
      auVar165 = vblendvps_avx(auVar41,auVar271,auVar165);
      _local_9a0 = vmaxps_avx(auVar14,auVar165);
      auVar165 = vcmpps_avx(auVar181,auVar221,6);
      auVar165 = vorps_avx(auVar160,auVar165);
      auVar105._8_4_ = 0x7f800000;
      auVar105._0_8_ = 0x7f8000007f800000;
      auVar105._12_4_ = 0x7f800000;
      auVar105._16_4_ = 0x7f800000;
      auVar105._20_4_ = 0x7f800000;
      auVar105._24_4_ = 0x7f800000;
      auVar105._28_4_ = 0x7f800000;
      auVar165 = vblendvps_avx(auVar41,auVar105,auVar165);
      auVar97 = vandps_avx(auVar97,local_5e0);
      local_400 = vminps_avx(auVar207,auVar165);
      auVar165 = vcmpps_avx(_local_9a0,local_400,2);
      auVar160 = auVar97 & auVar165;
      if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar160 >> 0x7f,0) != '\0') ||
            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar160 >> 0xbf,0) != '\0') ||
          (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar160[0x1f] < '\0') {
        auVar160 = vminps_avx(local_3a0,auVar240);
        auVar160 = vmaxps_avx(auVar160,ZEXT832(0) << 0x20);
        auVar63._4_4_ = fStack_3bc;
        auVar63._0_4_ = local_3c0;
        auVar63._8_4_ = fStack_3b8;
        auVar63._12_4_ = fStack_3b4;
        auVar63._16_4_ = uStack_3b0;
        auVar63._20_4_ = uStack_3ac;
        auVar63._24_4_ = uStack_3a8;
        auVar63._28_4_ = uStack_3a4;
        auVar14 = vminps_avx(auVar63,auVar240);
        auVar14 = vmaxps_avx(auVar14,ZEXT832(0) << 0x20);
        auVar42._4_4_ = (auVar160._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar160._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar160._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar160._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar160._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar160._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar160._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar160._28_4_ + 7.0;
        auVar8 = vfmadd213ps_fma(auVar42,local_840,local_820);
        auVar43._4_4_ = (auVar14._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar14._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar14._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar14._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar14._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar14._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar14._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar14._28_4_ + 7.0;
        auVar152 = vfmadd213ps_fma(auVar43,local_840,local_820);
        auVar160 = vminps_avx(local_860,auVar180);
        auVar14 = vminps_avx(auVar19,auVar20);
        auVar160 = vminps_avx(auVar160,auVar14);
        auVar98 = vsubps_avx(auVar160,auVar98);
        auVar97 = vandps_avx(auVar165,auVar97);
        local_1a0 = ZEXT1632(auVar8);
        local_1c0 = ZEXT1632(auVar152);
        auVar44._4_4_ = auVar98._4_4_ * 0.99999976;
        auVar44._0_4_ = auVar98._0_4_ * 0.99999976;
        auVar44._8_4_ = auVar98._8_4_ * 0.99999976;
        auVar44._12_4_ = auVar98._12_4_ * 0.99999976;
        auVar44._16_4_ = auVar98._16_4_ * 0.99999976;
        auVar44._20_4_ = auVar98._20_4_ * 0.99999976;
        auVar44._24_4_ = auVar98._24_4_ * 0.99999976;
        auVar44._28_4_ = 0x3f7ffffc;
        auVar165 = vmaxps_avx(ZEXT832(0) << 0x20,auVar44);
        auVar45._4_4_ = auVar165._4_4_ * auVar165._4_4_;
        auVar45._0_4_ = auVar165._0_4_ * auVar165._0_4_;
        auVar45._8_4_ = auVar165._8_4_ * auVar165._8_4_;
        auVar45._12_4_ = auVar165._12_4_ * auVar165._12_4_;
        auVar45._16_4_ = auVar165._16_4_ * auVar165._16_4_;
        auVar45._20_4_ = auVar165._20_4_ * auVar165._20_4_;
        auVar45._24_4_ = auVar165._24_4_ * auVar165._24_4_;
        auVar45._28_4_ = auVar165._28_4_;
        auVar98 = vsubps_avx(auVar16,auVar45);
        auVar46._4_4_ = auVar98._4_4_ * fVar143 * 4.0;
        auVar46._0_4_ = auVar98._0_4_ * fVar141 * 4.0;
        auVar46._8_4_ = auVar98._8_4_ * fVar145 * 4.0;
        auVar46._12_4_ = auVar98._12_4_ * fVar147 * 4.0;
        auVar46._16_4_ = auVar98._16_4_ * fVar149 * 4.0;
        auVar46._20_4_ = auVar98._20_4_ * fVar151 * 4.0;
        auVar46._24_4_ = auVar98._24_4_ * fVar242 * 4.0;
        auVar46._28_4_ = auVar165._28_4_;
        auVar165 = vsubps_avx(auVar32,auVar46);
        auVar56 = ZEXT412(0);
        auVar160 = ZEXT1232(auVar56) << 0x20;
        local_900 = ZEXT1232(auVar56) << 0x20;
        _local_ac0 = vcmpps_avx(auVar165,ZEXT832(0) << 0x20,5);
        auVar266 = local_a20._0_28_;
        if ((((((((_local_ac0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (_local_ac0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (_local_ac0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(_local_ac0 >> 0x7f,0) == '\0') &&
              (_local_ac0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(_local_ac0 >> 0xbf,0) == '\0') &&
            (_local_ac0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_ac0[0x1f]) {
          _local_920 = ZEXT1232(auVar56) << 0x20;
          auVar182 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar200 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar222._8_4_ = 0x7f800000;
          auVar222._0_8_ = 0x7f8000007f800000;
          auVar222._12_4_ = 0x7f800000;
          auVar222._16_4_ = 0x7f800000;
          auVar222._20_4_ = 0x7f800000;
          auVar222._24_4_ = 0x7f800000;
          auVar222._28_4_ = 0x7f800000;
          auVar229._8_4_ = 0xff800000;
          auVar229._0_8_ = 0xff800000ff800000;
          auVar229._12_4_ = 0xff800000;
          auVar229._16_4_ = 0xff800000;
          auVar229._20_4_ = 0xff800000;
          auVar229._24_4_ = 0xff800000;
          auVar229._28_4_ = 0xff800000;
          _local_8e0 = local_900;
        }
        else {
          auVar14 = vsqrtps_avx(auVar165);
          auVar183._0_4_ = fVar141 + fVar141;
          auVar183._4_4_ = fVar143 + fVar143;
          auVar183._8_4_ = fVar145 + fVar145;
          auVar183._12_4_ = fVar147 + fVar147;
          auVar183._16_4_ = fVar149 + fVar149;
          auVar183._20_4_ = fVar151 + fVar151;
          auVar183._24_4_ = fVar242 + fVar242;
          auVar183._28_4_ = fVar118 + fVar118;
          auVar160 = vrcpps_avx(auVar183);
          auVar8 = vfnmadd213ps_fma(auVar183,auVar160,auVar240);
          auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar160,auVar160);
          auVar210._0_4_ = (uint)local_2e0._0_4_ ^ local_7e0;
          auVar210._4_4_ = (uint)local_2e0._4_4_ ^ uStack_7dc;
          auVar210._8_4_ = (uint)local_2e0._8_4_ ^ uStack_7d8;
          auVar210._12_4_ = (uint)local_2e0._12_4_ ^ uStack_7d4;
          auVar210._16_4_ = (uint)local_2e0._16_4_ ^ (uint)fStack_7d0;
          auVar210._20_4_ = (uint)local_2e0._20_4_ ^ (uint)fStack_7cc;
          auVar210._24_4_ = (uint)local_2e0._24_4_ ^ (uint)fStack_7c8;
          auVar210._28_4_ = (uint)local_2e0._28_4_ ^ uStack_7c4;
          auVar160 = vsubps_avx(auVar210,auVar14);
          auVar14 = vsubps_avx(auVar14,local_2e0);
          fVar146 = auVar160._0_4_ * auVar8._0_4_;
          fVar148 = auVar160._4_4_ * auVar8._4_4_;
          auVar47._4_4_ = fVar148;
          auVar47._0_4_ = fVar146;
          fVar187 = auVar160._8_4_ * auVar8._8_4_;
          auVar47._8_4_ = fVar187;
          fVar188 = auVar160._12_4_ * auVar8._12_4_;
          auVar47._12_4_ = fVar188;
          fVar189 = auVar160._16_4_ * 0.0;
          auVar47._16_4_ = fVar189;
          fVar190 = auVar160._20_4_ * 0.0;
          auVar47._20_4_ = fVar190;
          fVar191 = auVar160._24_4_ * 0.0;
          auVar47._24_4_ = fVar191;
          auVar47._28_4_ = 0x3f800000;
          fVar118 = auVar14._0_4_ * auVar8._0_4_;
          fVar141 = auVar14._4_4_ * auVar8._4_4_;
          auVar48._4_4_ = fVar141;
          auVar48._0_4_ = fVar118;
          fVar143 = auVar14._8_4_ * auVar8._8_4_;
          auVar48._8_4_ = fVar143;
          fVar145 = auVar14._12_4_ * auVar8._12_4_;
          auVar48._12_4_ = fVar145;
          fVar147 = auVar14._16_4_ * 0.0;
          auVar48._16_4_ = fVar147;
          fVar149 = auVar14._20_4_ * 0.0;
          auVar48._20_4_ = fVar149;
          fVar151 = auVar14._24_4_ * 0.0;
          auVar48._24_4_ = fVar151;
          auVar48._28_4_ = 0x3f800000;
          auVar8 = vfmadd213ps_fma(auVar277,auVar47,auVar260);
          auVar152 = vfmadd213ps_fma(auVar277,auVar48,auVar260);
          auVar49._28_4_ = auVar160._28_4_;
          auVar49._0_28_ =
               ZEXT1628(CONCAT412(fVar142 * auVar8._12_4_,
                                  CONCAT48(fVar150 * auVar8._8_4_,
                                           CONCAT44(fVar140 * auVar8._4_4_,fVar117 * auVar8._0_4_)))
                       );
          auVar160 = ZEXT1632(CONCAT412(fVar142 * auVar152._12_4_,
                                        CONCAT48(fVar150 * auVar152._8_4_,
                                                 CONCAT44(fVar140 * auVar152._4_4_,
                                                          fVar117 * auVar152._0_4_))));
          auVar8 = vfmadd213ps_fma(auVar12,auVar49,auVar179);
          auVar152 = vfmadd213ps_fma(auVar12,auVar160,auVar179);
          auVar120 = vfmadd213ps_fma(auVar13,auVar49,auVar99);
          auVar84 = vfmadd213ps_fma(auVar13,auVar160,auVar99);
          auVar93 = vfmadd213ps_fma(auVar49,auVar182,auVar276);
          auVar89 = vfmadd213ps_fma(auVar182,auVar160,auVar276);
          auVar50._4_4_ = fVar148 * (float)local_8a0._4_4_;
          auVar50._0_4_ = fVar146 * (float)local_8a0._0_4_;
          auVar50._8_4_ = fVar187 * fStack_898;
          auVar50._12_4_ = fVar188 * fStack_894;
          auVar50._16_4_ = fVar189 * fStack_890;
          auVar50._20_4_ = fVar190 * fStack_88c;
          auVar50._24_4_ = fVar191 * fStack_888;
          auVar50._28_4_ = 0;
          auVar160 = vsubps_avx(auVar50,ZEXT1632(auVar8));
          auVar184._0_4_ = (float)local_ae0._0_4_ * fVar146;
          auVar184._4_4_ = (float)local_ae0._4_4_ * fVar148;
          auVar184._8_4_ = fStack_ad8 * fVar187;
          auVar184._12_4_ = fStack_ad4 * fVar188;
          auVar184._16_4_ = fStack_ad0 * fVar189;
          auVar184._20_4_ = fStack_acc * fVar190;
          auVar184._24_4_ = fStack_ac8 * fVar191;
          auVar184._28_4_ = 0;
          auVar182 = vsubps_avx(auVar184,ZEXT1632(auVar120));
          auVar223._0_4_ = (float)local_a20._0_4_ * fVar146;
          auVar223._4_4_ = (float)local_a20._4_4_ * fVar148;
          auVar223._8_4_ = fStack_a18 * fVar187;
          auVar223._12_4_ = fStack_a14 * fVar188;
          auVar223._16_4_ = fStack_a10 * fVar189;
          auVar223._20_4_ = fStack_a0c * fVar190;
          auVar223._24_4_ = fStack_a08 * fVar191;
          auVar223._28_4_ = 0;
          auVar12 = vsubps_avx(auVar223,ZEXT1632(auVar93));
          auVar200 = auVar12._0_28_;
          auVar51._4_4_ = fVar141 * (float)local_8a0._4_4_;
          auVar51._0_4_ = fVar118 * (float)local_8a0._0_4_;
          auVar51._8_4_ = fVar143 * fStack_898;
          auVar51._12_4_ = fVar145 * fStack_894;
          auVar51._16_4_ = fVar147 * fStack_890;
          auVar51._20_4_ = fVar149 * fStack_88c;
          auVar51._24_4_ = fVar151 * fStack_888;
          auVar51._28_4_ = 0;
          _local_8e0 = vsubps_avx(auVar51,ZEXT1632(auVar152));
          auVar52._4_4_ = (float)local_ae0._4_4_ * fVar141;
          auVar52._0_4_ = (float)local_ae0._0_4_ * fVar118;
          auVar52._8_4_ = fStack_ad8 * fVar143;
          auVar52._12_4_ = fStack_ad4 * fVar145;
          auVar52._16_4_ = fStack_ad0 * fVar147;
          auVar52._20_4_ = fStack_acc * fVar149;
          auVar52._24_4_ = fStack_ac8 * fVar151;
          auVar52._28_4_ = local_8e0._28_4_;
          local_900 = vsubps_avx(auVar52,ZEXT1632(auVar84));
          auVar53._4_4_ = (float)local_a20._4_4_ * fVar141;
          auVar53._0_4_ = (float)local_a20._0_4_ * fVar118;
          auVar53._8_4_ = fStack_a18 * fVar143;
          auVar53._12_4_ = fStack_a14 * fVar145;
          auVar53._16_4_ = fStack_a10 * fVar147;
          auVar53._20_4_ = fStack_a0c * fVar149;
          auVar53._24_4_ = fStack_a08 * fVar151;
          auVar53._28_4_ = local_900._28_4_;
          _local_920 = vsubps_avx(auVar53,ZEXT1632(auVar89));
          auVar261 = ZEXT864(0) << 0x20;
          auVar12 = vcmpps_avx(auVar165,_DAT_01faff00,5);
          auVar224._8_4_ = 0x7f800000;
          auVar224._0_8_ = 0x7f8000007f800000;
          auVar224._12_4_ = 0x7f800000;
          auVar224._16_4_ = 0x7f800000;
          auVar224._20_4_ = 0x7f800000;
          auVar224._24_4_ = 0x7f800000;
          auVar224._28_4_ = 0x7f800000;
          auVar222 = vblendvps_avx(auVar224,auVar47,auVar12);
          auVar60._4_4_ = uStack_8bc;
          auVar60._0_4_ = local_8c0;
          auVar60._8_4_ = uStack_8b8;
          auVar60._12_4_ = uStack_8b4;
          auVar60._16_4_ = uStack_8b0;
          auVar60._20_4_ = uStack_8ac;
          auVar60._24_4_ = uStack_8a8;
          auVar60._28_4_ = uStack_8a4;
          auVar165 = vandps_avx(auVar60,local_a00);
          auVar165 = vmaxps_avx(local_620,auVar165);
          auVar54._4_4_ = auVar165._4_4_ * 1.9073486e-06;
          auVar54._0_4_ = auVar165._0_4_ * 1.9073486e-06;
          auVar54._8_4_ = auVar165._8_4_ * 1.9073486e-06;
          auVar54._12_4_ = auVar165._12_4_ * 1.9073486e-06;
          auVar54._16_4_ = auVar165._16_4_ * 1.9073486e-06;
          auVar54._20_4_ = auVar165._20_4_ * 1.9073486e-06;
          auVar54._24_4_ = auVar165._24_4_ * 1.9073486e-06;
          auVar54._28_4_ = auVar165._28_4_;
          auVar165 = vandps_avx(auVar60,local_680);
          auVar165 = vcmpps_avx(auVar165,auVar54,1);
          auVar230._8_4_ = 0xff800000;
          auVar230._0_8_ = 0xff800000ff800000;
          auVar230._12_4_ = 0xff800000;
          auVar230._16_4_ = 0xff800000;
          auVar230._20_4_ = 0xff800000;
          auVar230._24_4_ = 0xff800000;
          auVar230._28_4_ = 0xff800000;
          auVar229 = vblendvps_avx(auVar230,auVar48,auVar12);
          auVar13 = auVar12 & auVar165;
          if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar13 >> 0x7f,0) != '\0') ||
                (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar13 >> 0xbf,0) != '\0') ||
              (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar13[0x1f] < '\0') {
            auVar165 = vandps_avx(auVar165,auVar12);
            auVar13 = vcmpps_avx(auVar98,ZEXT832(0) << 0x20,2);
            auVar268._8_4_ = 0xff800000;
            auVar268._0_8_ = 0xff800000ff800000;
            auVar268._12_4_ = 0xff800000;
            auVar268._16_4_ = 0xff800000;
            auVar268._20_4_ = 0xff800000;
            auVar268._24_4_ = 0xff800000;
            auVar268._28_4_ = 0xff800000;
            auVar272._8_4_ = 0x7f800000;
            auVar272._0_8_ = 0x7f8000007f800000;
            auVar272._12_4_ = 0x7f800000;
            auVar272._16_4_ = 0x7f800000;
            auVar272._20_4_ = 0x7f800000;
            auVar272._24_4_ = 0x7f800000;
            auVar272._28_4_ = 0x7f800000;
            auVar98 = vblendvps_avx(auVar272,auVar268,auVar13);
            auVar8 = vpackssdw_avx(auVar165._0_16_,auVar165._16_16_);
            auVar14 = vpmovsxwd_avx2(auVar8);
            auVar222 = vblendvps_avx(auVar222,auVar98,auVar14);
            auVar98 = vblendvps_avx(auVar268,auVar272,auVar13);
            auVar261 = ZEXT3264(auVar98);
            auVar229 = vblendvps_avx(auVar229,auVar98,auVar14);
            auVar241._0_8_ = auVar165._0_8_ ^ 0xffffffffffffffff;
            auVar241._8_4_ = auVar165._8_4_ ^ 0xffffffff;
            auVar241._12_4_ = auVar165._12_4_ ^ 0xffffffff;
            auVar241._16_4_ = auVar165._16_4_ ^ 0xffffffff;
            auVar241._20_4_ = auVar165._20_4_ ^ 0xffffffff;
            auVar241._24_4_ = auVar165._24_4_ ^ 0xffffffff;
            auVar241._28_4_ = auVar165._28_4_ ^ 0xffffffff;
            auVar165 = vorps_avx(auVar13,auVar241);
            _local_ac0 = vandps_avx(auVar165,auVar12);
          }
        }
        local_580 = _local_9a0;
        local_560 = vminps_avx(local_400,auVar222);
        local_800 = vmaxps_avx(_local_9a0,auVar229);
        local_420 = local_800;
        auVar165 = vcmpps_avx(_local_9a0,local_560,2);
        local_740 = vandps_avx(auVar165,auVar97);
        auVar165 = vcmpps_avx(local_800,local_400,2);
        local_780 = vandps_avx(auVar165,auVar97);
        auVar97 = vorps_avx(local_780,local_740);
        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar97 >> 0x7f,0) != '\0') ||
              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar97 >> 0xbf,0) != '\0') ||
            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar97[0x1f] < '\0') {
          local_7a0._0_8_ = local_ac0 ^ 0xffffffffffffffff;
          local_7a0._8_4_ = (uint)fStack_ab8 ^ 0xffffffff;
          local_7a0._12_4_ = (uint)fStack_ab4 ^ 0xffffffff;
          local_7a0._16_4_ = uStack_ab0 ^ 0xffffffff;
          local_7a0._20_4_ = uStack_aac ^ 0xffffffff;
          local_7a0._24_4_ = uStack_aa8 ^ 0xffffffff;
          local_7a0._28_4_ = uStack_aa4 ^ 0xffffffff;
          auVar55._4_4_ = (float)local_a20._4_4_ * auVar200._4_4_;
          auVar55._0_4_ = (float)local_a20._0_4_ * auVar200._0_4_;
          auVar55._8_4_ = fStack_a18 * auVar200._8_4_;
          auVar55._12_4_ = fStack_a14 * auVar200._12_4_;
          auVar55._16_4_ = fStack_a10 * auVar200._16_4_;
          auVar55._20_4_ = fStack_a0c * auVar200._20_4_;
          auVar55._24_4_ = fStack_a08 * auVar200._24_4_;
          auVar55._28_4_ = uStack_aa4;
          auVar8 = vfmadd213ps_fma(auVar182,_local_ae0,auVar55);
          auVar8 = vfmadd213ps_fma(auVar160,_local_8a0,ZEXT1632(auVar8));
          auVar61._4_4_ = uStack_8bc;
          auVar61._0_4_ = local_8c0;
          auVar61._8_4_ = uStack_8b8;
          auVar61._12_4_ = uStack_8b4;
          auVar61._16_4_ = uStack_8b0;
          auVar61._20_4_ = uStack_8ac;
          auVar61._24_4_ = uStack_8a8;
          auVar61._28_4_ = uStack_8a4;
          auVar97 = vandps_avx(ZEXT1632(auVar8),auVar61);
          auVar135._8_4_ = 0x3e99999a;
          auVar135._0_8_ = 0x3e99999a3e99999a;
          auVar135._12_4_ = 0x3e99999a;
          auVar135._16_4_ = 0x3e99999a;
          auVar135._20_4_ = 0x3e99999a;
          auVar135._24_4_ = 0x3e99999a;
          auVar135._28_4_ = 0x3e99999a;
          auVar97 = vcmpps_avx(auVar97,auVar135,1);
          auVar97 = vorps_avx(auVar97,local_7a0);
          auVar136._8_4_ = 3;
          auVar136._0_8_ = 0x300000003;
          auVar136._12_4_ = 3;
          auVar136._16_4_ = 3;
          auVar136._20_4_ = 3;
          auVar136._24_4_ = 3;
          auVar136._28_4_ = 3;
          auVar161._8_4_ = 2;
          auVar161._0_8_ = 0x200000002;
          auVar161._12_4_ = 2;
          auVar161._16_4_ = 2;
          auVar161._20_4_ = 2;
          auVar161._24_4_ = 2;
          auVar161._28_4_ = 2;
          auVar97 = vblendvps_avx(auVar161,auVar136,auVar97);
          local_7c0._4_4_ = local_cc4;
          local_7c0._0_4_ = local_cc4;
          local_7c0._8_4_ = local_cc4;
          local_7c0._12_4_ = local_cc4;
          local_7c0._16_4_ = local_cc4;
          local_7c0._20_4_ = local_cc4;
          local_7c0._24_4_ = local_cc4;
          local_7c0._28_4_ = local_cc4;
          local_760 = vpcmpgtd_avx2(auVar97,local_7c0);
          local_700 = vpandn_avx2(local_760,local_740);
          auVar248 = ZEXT3264(local_700);
          auVar97 = local_740 & ~local_760;
          fStack_b9c = auVar7._4_4_;
          fStack_b98 = auVar7._8_4_;
          fStack_b94 = auVar7._12_4_;
          if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar97 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar97 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar97 >> 0x7f,0) == '\0') &&
                (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar97 >> 0xbf,0) == '\0') &&
              (auVar97 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar97[0x1f]) {
            auVar109._4_4_ = fVar144;
            auVar109._0_4_ = fVar144;
            auVar109._8_4_ = fVar144;
            auVar109._12_4_ = fVar144;
            auVar109._16_4_ = fVar144;
            auVar109._20_4_ = fVar144;
            auVar109._24_4_ = fVar144;
            auVar109._28_4_ = fVar144;
          }
          else {
            auVar152 = vminps_avx(auVar9,auVar85);
            auVar8 = vmaxps_avx(auVar9,auVar85);
            auVar120 = vminps_avx(auVar86,auVar7);
            auVar84 = vminps_avx(auVar152,auVar120);
            auVar152 = vmaxps_avx(auVar86,auVar7);
            auVar120 = vmaxps_avx(auVar8,auVar152);
            auVar8 = vandps_avx(auVar84,auVar231);
            auVar152 = vandps_avx(auVar120,auVar231);
            auVar8 = vmaxps_avx(auVar8,auVar152);
            auVar152 = vmovshdup_avx(auVar8);
            auVar152 = vmaxss_avx(auVar152,auVar8);
            auVar8 = vshufpd_avx(auVar8,auVar8,1);
            auVar8 = vmaxss_avx(auVar8,auVar152);
            local_ac0._0_4_ = auVar8._0_4_ * 1.9073486e-06;
            local_880 = vshufps_avx(auVar120,auVar120,0xff);
            local_b60._4_4_ = (float)local_9a0._4_4_ + (float)local_980._4_4_;
            local_b60._0_4_ = (float)local_9a0._0_4_ + (float)local_980._0_4_;
            fStack_b58 = fStack_998 + fStack_978;
            fStack_b54 = fStack_994 + fStack_974;
            fStack_b50 = fStack_990 + fStack_970;
            fStack_b4c = fStack_98c + fStack_96c;
            fStack_b48 = fStack_988 + fStack_968;
            fStack_b44 = fStack_984 + fStack_964;
            do {
              auVar110._8_4_ = 0x7f800000;
              auVar110._0_8_ = 0x7f8000007f800000;
              auVar110._12_4_ = 0x7f800000;
              auVar110._16_4_ = 0x7f800000;
              auVar110._20_4_ = 0x7f800000;
              auVar110._24_4_ = 0x7f800000;
              auVar110._28_4_ = 0x7f800000;
              auVar97 = auVar248._0_32_;
              auVar165 = vblendvps_avx(auVar110,_local_9a0,auVar97);
              auVar98 = vshufps_avx(auVar165,auVar165,0xb1);
              auVar98 = vminps_avx(auVar165,auVar98);
              auVar160 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar160);
              auVar160 = vpermpd_avx2(auVar98,0x4e);
              auVar98 = vminps_avx(auVar98,auVar160);
              auVar165 = vcmpps_avx(auVar165,auVar98,0);
              auVar98 = auVar97 & auVar165;
              if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar98 >> 0x7f,0) != '\0') ||
                    (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar98 >> 0xbf,0) != '\0') ||
                  (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar98[0x1f] < '\0') {
                auVar97 = vandps_avx(auVar165,auVar97);
              }
              uVar74 = vmovmskps_avx(auVar97);
              iVar21 = 0;
              for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar75 = iVar21 << 2;
              *(undefined4 *)(local_700 + uVar75) = 0;
              uVar74 = *(uint *)(local_1a0 + uVar75);
              uVar75 = *(uint *)(local_580 + uVar75);
              fVar118 = auVar4._0_4_;
              if ((float)local_a40._0_4_ < 0.0) {
                fVar118 = sqrtf((float)local_a40._0_4_);
              }
              local_820._0_4_ = fVar118 * 1.9073486e-06;
              auVar8 = vinsertps_avx(ZEXT416(uVar75),ZEXT416(uVar74),0x10);
              bVar79 = true;
              uVar77 = 0;
              do {
                auVar120 = vmovshdup_avx(auVar8);
                fVar143 = 1.0 - auVar120._0_4_;
                local_9c0._0_16_ = ZEXT416((uint)fVar143);
                auVar152 = vshufps_avx(auVar8,auVar8,0x55);
                fVar118 = auVar152._0_4_;
                auVar121._0_4_ = fVar114 * fVar118;
                fVar117 = auVar152._4_4_;
                auVar121._4_4_ = auVar85._4_4_ * fVar117;
                fVar141 = auVar152._8_4_;
                auVar121._8_4_ = auVar85._8_4_ * fVar141;
                fVar140 = auVar152._12_4_;
                auVar121._12_4_ = auVar85._12_4_ * fVar140;
                auVar153._4_4_ = fVar143;
                auVar153._0_4_ = fVar143;
                auVar153._8_4_ = fVar143;
                auVar153._12_4_ = fVar143;
                auVar152 = vfmadd231ps_fma(auVar121,auVar153,auVar9);
                auVar167._0_4_ = fVar115 * fVar118;
                auVar167._4_4_ = auVar86._4_4_ * fVar117;
                auVar167._8_4_ = auVar86._8_4_ * fVar141;
                auVar167._12_4_ = auVar86._12_4_ * fVar140;
                auVar84 = vfmadd231ps_fma(auVar167,auVar153,auVar85);
                auVar215._0_4_ = fVar118 * auVar84._0_4_;
                auVar215._4_4_ = fVar117 * auVar84._4_4_;
                auVar215._8_4_ = fVar141 * auVar84._8_4_;
                auVar215._12_4_ = fVar140 * auVar84._12_4_;
                auVar93 = vfmadd231ps_fma(auVar215,auVar153,auVar152);
                auVar122._0_4_ = fVar118 * fVar116;
                auVar122._4_4_ = fVar117 * fStack_b9c;
                auVar122._8_4_ = fVar141 * fStack_b98;
                auVar122._12_4_ = fVar140 * fStack_b94;
                auVar152 = vfmadd231ps_fma(auVar122,auVar153,auVar86);
                auVar194._0_4_ = fVar118 * auVar152._0_4_;
                auVar194._4_4_ = fVar117 * auVar152._4_4_;
                auVar194._8_4_ = fVar141 * auVar152._8_4_;
                auVar194._12_4_ = fVar140 * auVar152._12_4_;
                auVar84 = vfmadd231ps_fma(auVar194,auVar153,auVar84);
                fVar150 = auVar8._0_4_;
                auVar123._4_4_ = fVar150;
                auVar123._0_4_ = fVar150;
                auVar123._8_4_ = fVar150;
                auVar123._12_4_ = fVar150;
                auVar152 = vfmadd213ps_fma(auVar123,local_a30,_DAT_01f7aa10);
                auVar88._0_4_ = fVar118 * auVar84._0_4_;
                auVar88._4_4_ = fVar117 * auVar84._4_4_;
                auVar88._8_4_ = fVar141 * auVar84._8_4_;
                auVar88._12_4_ = fVar140 * auVar84._12_4_;
                auVar89 = vfmadd231ps_fma(auVar88,auVar93,auVar153);
                local_9e0._0_16_ = auVar89;
                auVar152 = vsubps_avx(auVar152,auVar89);
                _local_a60 = auVar152;
                auVar152 = vdpps_avx(auVar152,auVar152,0x7f);
                fVar118 = auVar152._0_4_;
                if (fVar118 < 0.0) {
                  local_9c0._0_16_ = ZEXT416((uint)fVar143);
                  auVar248._0_4_ = sqrtf(fVar118);
                  auVar248._4_60_ = extraout_var;
                  auVar89 = auVar248._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar152,auVar152);
                }
                auVar84 = vsubps_avx(auVar84,auVar93);
                auVar226._0_4_ = auVar84._0_4_ * 3.0;
                auVar226._4_4_ = auVar84._4_4_ * 3.0;
                auVar226._8_4_ = auVar84._8_4_ * 3.0;
                auVar226._12_4_ = auVar84._12_4_ * 3.0;
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9c0._0_16_,auVar120);
                auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar120,local_9c0._0_16_);
                fVar117 = local_9c0._0_4_ * 6.0;
                fVar141 = auVar84._0_4_ * 6.0;
                fVar140 = auVar93._0_4_ * 6.0;
                fVar143 = auVar120._0_4_ * 6.0;
                auVar168._0_4_ = fVar143 * fVar116;
                auVar168._4_4_ = fVar143 * fStack_b9c;
                auVar168._8_4_ = fVar143 * fStack_b98;
                auVar168._12_4_ = fVar143 * fStack_b94;
                auVar124._4_4_ = fVar140;
                auVar124._0_4_ = fVar140;
                auVar124._8_4_ = fVar140;
                auVar124._12_4_ = fVar140;
                auVar120 = vfmadd132ps_fma(auVar124,auVar168,auVar86);
                auVar169._4_4_ = fVar141;
                auVar169._0_4_ = fVar141;
                auVar169._8_4_ = fVar141;
                auVar169._12_4_ = fVar141;
                auVar120 = vfmadd132ps_fma(auVar169,auVar120,auVar85);
                auVar84 = vdpps_avx(auVar226,auVar226,0x7f);
                auVar125._4_4_ = fVar117;
                auVar125._0_4_ = fVar117;
                auVar125._8_4_ = fVar117;
                auVar125._12_4_ = fVar117;
                auVar193 = vfmadd132ps_fma(auVar125,auVar120,auVar9);
                auVar120 = vblendps_avx(auVar84,_DAT_01f7aa10,0xe);
                auVar93 = vrsqrtss_avx(auVar120,auVar120);
                fVar140 = auVar84._0_4_;
                fVar117 = auVar93._0_4_;
                auVar93 = vdpps_avx(auVar226,auVar193,0x7f);
                fVar117 = fVar117 * 1.5 + fVar140 * -0.5 * fVar117 * fVar117 * fVar117;
                auVar126._0_4_ = auVar193._0_4_ * fVar140;
                auVar126._4_4_ = auVar193._4_4_ * fVar140;
                auVar126._8_4_ = auVar193._8_4_ * fVar140;
                auVar126._12_4_ = auVar193._12_4_ * fVar140;
                fVar141 = auVar93._0_4_;
                auVar216._0_4_ = auVar226._0_4_ * fVar141;
                auVar216._4_4_ = auVar226._4_4_ * fVar141;
                auVar216._8_4_ = auVar226._8_4_ * fVar141;
                auVar216._12_4_ = auVar226._12_4_ * fVar141;
                auVar93 = vsubps_avx(auVar126,auVar216);
                auVar120 = vrcpss_avx(auVar120,auVar120);
                auVar193 = vfnmadd213ss_fma(auVar120,auVar84,ZEXT416(0x40000000));
                fVar141 = auVar120._0_4_ * auVar193._0_4_;
                auVar120 = vmaxss_avx(ZEXT416((uint)local_ac0._0_4_),
                                      ZEXT416((uint)(fVar150 * (float)local_820._0_4_)));
                uVar57 = CONCAT44(auVar226._4_4_,auVar226._0_4_);
                auVar244._0_8_ = uVar57 ^ 0x8000000080000000;
                auVar244._8_4_ = -auVar226._8_4_;
                auVar244._12_4_ = -auVar226._12_4_;
                local_aa0._0_4_ = fVar117 * auVar93._0_4_ * fVar141;
                local_aa0._4_4_ = fVar117 * auVar93._4_4_ * fVar141;
                local_aa0._8_4_ = fVar117 * auVar93._8_4_ * fVar141;
                local_aa0._12_4_ = fVar117 * auVar93._12_4_ * fVar141;
                local_a80._0_4_ = auVar226._0_4_ * fVar117;
                local_a80._4_4_ = auVar226._4_4_ * fVar117;
                local_a80._8_4_ = auVar226._8_4_ * fVar117;
                local_a80._12_4_ = auVar226._12_4_ * fVar117;
                local_9c0._0_16_ = auVar226;
                if (fVar140 < -fVar140) {
                  fVar117 = sqrtf(fVar140);
                  auVar89 = ZEXT416(auVar89._0_4_);
                }
                else {
                  auVar84 = vsqrtss_avx(auVar84,auVar84);
                  fVar117 = auVar84._0_4_;
                }
                auVar84 = vdpps_avx(_local_a60,local_a80._0_16_,0x7f);
                auVar83 = vfmadd213ss_fma(ZEXT416((uint)local_ac0._0_4_),auVar89,
                                          ZEXT416((uint)auVar120._0_4_));
                auVar93 = vdpps_avx(auVar244,local_a80._0_16_,0x7f);
                auVar193 = vdpps_avx(_local_a60,local_aa0._0_16_,0x7f);
                local_aa0._0_16_ = vdpps_avx(local_a30,local_a80._0_16_,0x7f);
                auVar192 = vfmadd213ss_fma(ZEXT416((uint)(auVar89._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_ac0._0_4_ / fVar117)),auVar83
                                          );
                fVar141 = auVar84._0_4_;
                auVar90._0_4_ = fVar141 * fVar141;
                auVar90._4_4_ = auVar84._4_4_ * auVar84._4_4_;
                auVar90._8_4_ = auVar84._8_4_ * auVar84._8_4_;
                auVar90._12_4_ = auVar84._12_4_ * auVar84._12_4_;
                auVar89 = vdpps_avx(_local_a60,auVar244,0x7f);
                auVar119 = vsubps_avx(auVar152,auVar90);
                auVar83 = vrsqrtss_avx(auVar119,auVar119);
                fVar140 = auVar119._0_4_;
                fVar117 = auVar83._0_4_;
                fVar117 = fVar117 * 1.5 + fVar140 * -0.5 * fVar117 * fVar117 * fVar117;
                auVar83 = vdpps_avx(_local_a60,local_a30,0x7f);
                local_a80._0_16_ = ZEXT416((uint)(auVar93._0_4_ + auVar193._0_4_));
                local_a00._0_16_ = vfnmadd231ss_fma(auVar89,auVar84,local_a80._0_16_);
                auVar93 = vfnmadd231ss_fma(auVar83,auVar84,local_aa0._0_16_);
                if (fVar140 < 0.0) {
                  local_840._0_4_ = fVar117;
                  local_860._0_16_ = auVar93;
                  fVar140 = sqrtf(fVar140);
                  fVar117 = (float)local_840._0_4_;
                  auVar93 = local_860._0_16_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar119,auVar119);
                  fVar140 = auVar89._0_4_;
                }
                auVar261 = ZEXT1664(auVar152);
                auVar266 = local_a20._0_28_;
                auVar89 = vpermilps_avx(local_9e0._0_16_,0xff);
                fVar140 = fVar140 - auVar89._0_4_;
                auVar193 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xff);
                auVar89 = vfmsub213ss_fma(local_a00._0_16_,ZEXT416((uint)fVar117),auVar193);
                auVar170._0_8_ = local_aa0._0_8_ ^ 0x8000000080000000;
                auVar170._8_4_ = local_aa0._8_4_ ^ 0x80000000;
                auVar170._12_4_ = local_aa0._12_4_ ^ 0x80000000;
                auVar195._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                auVar195._8_4_ = auVar89._8_4_ ^ 0x80000000;
                auVar195._12_4_ = auVar89._12_4_ ^ 0x80000000;
                auVar93 = ZEXT416((uint)(auVar93._0_4_ * fVar117));
                auVar89 = vfmsub231ss_fma(ZEXT416((uint)(local_aa0._0_4_ * auVar89._0_4_)),
                                          local_a80._0_16_,auVar93);
                auVar93 = vinsertps_avx(auVar195,auVar93,0x1c);
                uVar81 = auVar89._0_4_;
                auVar196._4_4_ = uVar81;
                auVar196._0_4_ = uVar81;
                auVar196._8_4_ = uVar81;
                auVar196._12_4_ = uVar81;
                auVar93 = vdivps_avx(auVar93,auVar196);
                auVar89 = vinsertps_avx(local_a80._0_16_,auVar170,0x10);
                auVar89 = vdivps_avx(auVar89,auVar196);
                auVar154._0_4_ = fVar141 * auVar93._0_4_ + fVar140 * auVar89._0_4_;
                auVar154._4_4_ = fVar141 * auVar93._4_4_ + fVar140 * auVar89._4_4_;
                auVar154._8_4_ = fVar141 * auVar93._8_4_ + fVar140 * auVar89._8_4_;
                auVar154._12_4_ = fVar141 * auVar93._12_4_ + fVar140 * auVar89._12_4_;
                auVar8 = vsubps_avx(auVar8,auVar154);
                auVar84 = vandps_avx(auVar84,auVar231);
                if (auVar84._0_4_ < auVar192._0_4_) {
                  auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar192._0_4_ + auVar120._0_4_)),
                                            local_880,ZEXT416(0x36000000));
                  auVar120 = vandps_avx(ZEXT416((uint)fVar140),auVar231);
                  if (auVar120._0_4_ < auVar84._0_4_) {
                    fVar117 = auVar8._0_4_ + (float)local_940._0_4_;
                    if (fVar117 < fVar80) {
                      bVar70 = 0;
                      goto LAB_0163c2f5;
                    }
                    fVar141 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar117 <= fVar141) {
                      auVar8 = vmovshdup_avx(auVar8);
                      bVar70 = 0;
                      if ((auVar8._0_4_ < 0.0) || (1.0 < auVar8._0_4_)) goto LAB_0163c2f5;
                      auVar120 = vrsqrtss_avx(auVar152,auVar152);
                      fVar140 = auVar120._0_4_;
                      pGVar2 = (context->scene->geometries).items[uVar71].ptr;
                      if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                        bVar70 = 0;
                        goto LAB_0163c2f5;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar70 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_0163c2f5;
                      fVar118 = fVar140 * 1.5 + fVar118 * -0.5 * fVar140 * fVar140 * fVar140;
                      auVar171._0_4_ = fVar118 * (float)local_a60._0_4_;
                      auVar171._4_4_ = fVar118 * (float)local_a60._4_4_;
                      auVar171._8_4_ = fVar118 * fStack_a58;
                      auVar171._12_4_ = fVar118 * fStack_a54;
                      auVar89 = vfmadd213ps_fma(auVar193,auVar171,local_9c0._0_16_);
                      auVar120 = vshufps_avx(auVar171,auVar171,0xc9);
                      auVar84 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xc9);
                      auVar172._0_4_ = auVar171._0_4_ * auVar84._0_4_;
                      auVar172._4_4_ = auVar171._4_4_ * auVar84._4_4_;
                      auVar172._8_4_ = auVar171._8_4_ * auVar84._8_4_;
                      auVar172._12_4_ = auVar171._12_4_ * auVar84._12_4_;
                      auVar93 = vfmsub231ps_fma(auVar172,local_9c0._0_16_,auVar120);
                      auVar120 = vshufps_avx(auVar93,auVar93,0xc9);
                      auVar84 = vshufps_avx(auVar89,auVar89,0xc9);
                      auVar93 = vshufps_avx(auVar93,auVar93,0xd2);
                      auVar91._0_4_ = auVar89._0_4_ * auVar93._0_4_;
                      auVar91._4_4_ = auVar89._4_4_ * auVar93._4_4_;
                      auVar91._8_4_ = auVar89._8_4_ * auVar93._8_4_;
                      auVar91._12_4_ = auVar89._12_4_ * auVar93._12_4_;
                      auVar120 = vfmsub231ps_fma(auVar91,auVar120,auVar84);
                      local_4e0 = auVar8._0_8_;
                      auVar8 = vmovshdup_avx(auVar120);
                      local_540._8_8_ = auVar8._0_8_;
                      auVar8 = vshufps_avx(auVar120,auVar120,0xaa);
                      local_520 = auVar8._0_8_;
                      local_500 = auVar120._0_4_;
                      local_540._0_8_ = local_540._8_8_;
                      local_540._16_8_ = local_540._8_8_;
                      local_540._24_8_ = local_540._8_8_;
                      uStack_518 = local_520;
                      uStack_510 = local_520;
                      uStack_508 = local_520;
                      uStack_4fc = local_500;
                      uStack_4f8 = local_500;
                      uStack_4f4 = local_500;
                      uStack_4f0 = local_500;
                      uStack_4ec = local_500;
                      uStack_4e8 = local_500;
                      uStack_4e4 = local_500;
                      uStack_4d8 = local_4e0;
                      uStack_4d0 = local_4e0;
                      uStack_4c8 = local_4e0;
                      auVar155._12_4_ = 0;
                      auVar155._0_12_ = ZEXT812(0);
                      auVar155 = auVar155 << 0x20;
                      local_4c0 = ZEXT1232(ZEXT812(0)) << 0x20;
                      local_4a0 = CONCAT44(uStack_65c,local_660);
                      uStack_498 = CONCAT44(uStack_654,uStack_658);
                      uStack_490 = CONCAT44(uStack_64c,uStack_650);
                      uStack_488 = CONCAT44(uStack_644,uStack_648);
                      local_480._4_4_ = uStack_63c;
                      local_480._0_4_ = local_640;
                      local_480._8_4_ = uStack_638;
                      local_480._12_4_ = uStack_634;
                      local_480._16_4_ = uStack_630;
                      local_480._20_4_ = uStack_62c;
                      local_480._24_4_ = uStack_628;
                      local_480._28_4_ = uStack_624;
                      vpcmpeqd_avx2(local_480,local_480);
                      local_460 = context->user->instID[0];
                      uStack_45c = local_460;
                      uStack_458 = local_460;
                      uStack_454 = local_460;
                      uStack_450 = local_460;
                      uStack_44c = local_460;
                      uStack_448 = local_460;
                      uStack_444 = local_460;
                      local_440 = context->user->instPrimID[0];
                      uStack_43c = local_440;
                      uStack_438 = local_440;
                      uStack_434 = local_440;
                      uStack_430 = local_440;
                      uStack_42c = local_440;
                      uStack_428 = local_440;
                      uStack_424 = local_440;
                      *(float *)(ray + k * 4 + 0x100) = fVar117;
                      local_960 = local_6a0;
                      local_b10.valid = (int *)local_960;
                      local_b10.geometryUserPtr = pGVar2->userPtr;
                      local_b10.context = context->user;
                      local_b10.hit = (RTCHitN *)local_540;
                      local_b10.N = 8;
                      local_b10.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar261 = ZEXT1664(auVar152);
                        (*pGVar2->occlusionFilterN)(&local_b10);
                        auVar266 = local_a20._0_28_;
                        auVar155 = ZEXT816(0) << 0x40;
                      }
                      auVar165 = ZEXT1632(auVar155);
                      auVar97 = vpcmpeqd_avx2(local_960,auVar165);
                      auVar97 = _DAT_01fe9960 & ~auVar97;
                      if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar97 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar97 >> 0x7f,0) != '\0') ||
                            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar97 >> 0xbf,0) != '\0') ||
                          (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar97[0x1f] < '\0') {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar261 = ZEXT1664(auVar261._0_16_);
                          (*p_Var3)(&local_b10);
                          auVar266 = local_a20._0_28_;
                          auVar165 = ZEXT832(0) << 0x40;
                        }
                        auVar165 = vpcmpeqd_avx2(local_960,auVar165);
                        auVar137._8_4_ = 0xff800000;
                        auVar137._0_8_ = 0xff800000ff800000;
                        auVar137._12_4_ = 0xff800000;
                        auVar137._16_4_ = 0xff800000;
                        auVar137._20_4_ = 0xff800000;
                        auVar137._24_4_ = 0xff800000;
                        auVar137._28_4_ = 0xff800000;
                        auVar97 = vblendvps_avx(auVar137,*(undefined1 (*) [32])
                                                          (local_b10.ray + 0x100),auVar165);
                        *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar97;
                        auVar97 = _DAT_01fe9960 & ~auVar165;
                        if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar97 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar97 >> 0x7f,0) != '\0') ||
                              (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar97 >> 0xbf,0) != '\0') ||
                            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar97[0x1f] < '\0') {
                          bVar70 = 1;
                          goto LAB_0163c2f5;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar141;
                    }
                    bVar70 = 0;
                    goto LAB_0163c2f5;
                  }
                }
                bVar79 = uVar77 < 4;
                uVar77 = uVar77 + 1;
              } while (uVar77 != 5);
              bVar79 = false;
              bVar70 = 5;
LAB_0163c2f5:
              bVar78 = (bool)(bVar78 | bVar79 & bVar70);
              uVar81 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar109._4_4_ = uVar81;
              auVar109._0_4_ = uVar81;
              auVar109._8_4_ = uVar81;
              auVar109._12_4_ = uVar81;
              auVar109._16_4_ = uVar81;
              auVar109._20_4_ = uVar81;
              auVar109._24_4_ = uVar81;
              auVar109._28_4_ = uVar81;
              auVar165 = vcmpps_avx(_local_b60,auVar109,2);
              auVar97 = vandps_avx(auVar165,local_700);
              auVar248 = ZEXT3264(auVar97);
              auVar165 = local_700 & auVar165;
              local_700 = auVar97;
            } while ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar165 >> 0x7f,0) != '\0') ||
                       (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar165 >> 0xbf,0) != '\0') ||
                     (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar165[0x1f] < '\0');
          }
          auVar98 = local_420;
          auVar139._0_4_ = auVar266._0_4_ * (float)local_920._0_4_;
          auVar139._4_4_ = auVar266._4_4_ * (float)local_920._4_4_;
          auVar139._8_4_ = auVar266._8_4_ * fStack_918;
          auVar139._12_4_ = auVar266._12_4_ * fStack_914;
          auVar139._16_4_ = auVar266._16_4_ * fStack_910;
          auVar139._20_4_ = auVar266._20_4_ * fStack_90c;
          auVar139._28_36_ = auVar248._28_36_;
          auVar139._24_4_ = auVar266._24_4_ * fStack_908;
          auVar8 = vfmadd213ps_fma(local_900,_local_ae0,auVar139._0_32_);
          auVar8 = vfmadd213ps_fma(_local_8e0,_local_8a0,ZEXT1632(auVar8));
          auVar62._4_4_ = uStack_8bc;
          auVar62._0_4_ = local_8c0;
          auVar62._8_4_ = uStack_8b8;
          auVar62._12_4_ = uStack_8b4;
          auVar62._16_4_ = uStack_8b0;
          auVar62._20_4_ = uStack_8ac;
          auVar62._24_4_ = uStack_8a8;
          auVar62._28_4_ = uStack_8a4;
          auVar97 = vandps_avx(ZEXT1632(auVar8),auVar62);
          auVar162._8_4_ = 0x3e99999a;
          auVar162._0_8_ = 0x3e99999a3e99999a;
          auVar162._12_4_ = 0x3e99999a;
          auVar162._16_4_ = 0x3e99999a;
          auVar162._20_4_ = 0x3e99999a;
          auVar162._24_4_ = 0x3e99999a;
          auVar162._28_4_ = 0x3e99999a;
          auVar97 = vcmpps_avx(auVar97,auVar162,1);
          auVar165 = vorps_avx(auVar97,local_7a0);
          auVar163._0_4_ = local_800._0_4_ + (float)local_980._0_4_;
          auVar163._4_4_ = local_800._4_4_ + (float)local_980._4_4_;
          auVar163._8_4_ = local_800._8_4_ + fStack_978;
          auVar163._12_4_ = local_800._12_4_ + fStack_974;
          auVar163._16_4_ = local_800._16_4_ + fStack_970;
          auVar163._20_4_ = local_800._20_4_ + fStack_96c;
          auVar163._24_4_ = local_800._24_4_ + fStack_968;
          auVar163._28_4_ = local_800._28_4_ + fStack_964;
          auVar97 = vcmpps_avx(auVar163,auVar109,2);
          local_900 = vandps_avx(auVar97,local_780);
          auVar164._8_4_ = 3;
          auVar164._0_8_ = 0x300000003;
          auVar164._12_4_ = 3;
          auVar164._16_4_ = 3;
          auVar164._20_4_ = 3;
          auVar164._24_4_ = 3;
          auVar164._28_4_ = 3;
          auVar185._8_4_ = 2;
          auVar185._0_8_ = 0x200000002;
          auVar185._12_4_ = 2;
          auVar185._16_4_ = 2;
          auVar185._20_4_ = 2;
          auVar185._24_4_ = 2;
          auVar185._28_4_ = 2;
          auVar97 = vblendvps_avx(auVar185,auVar164,auVar165);
          _local_920 = vpcmpgtd_avx2(auVar97,local_7c0);
          auVar97 = vpandn_avx2(_local_920,local_900);
          auVar165 = local_900 & ~_local_920;
          local_720 = auVar97;
          if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar165 >> 0x7f,0) != '\0') ||
                (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar165 >> 0xbf,0) != '\0') ||
              (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar165[0x1f] < '\0') {
            auVar152 = vminps_avx(auVar9,auVar85);
            auVar8 = vmaxps_avx(auVar9,auVar85);
            auVar120 = vminps_avx(auVar86,auVar7);
            auVar84 = vminps_avx(auVar152,auVar120);
            auVar152 = vmaxps_avx(auVar86,auVar7);
            auVar120 = vmaxps_avx(auVar8,auVar152);
            auVar8 = vandps_avx(auVar84,auVar231);
            auVar152 = vandps_avx(auVar120,auVar231);
            auVar8 = vmaxps_avx(auVar8,auVar152);
            auVar152 = vmovshdup_avx(auVar8);
            auVar152 = vmaxss_avx(auVar152,auVar8);
            auVar8 = vshufpd_avx(auVar8,auVar8,1);
            auVar8 = vmaxss_avx(auVar8,auVar152);
            fVar118 = auVar8._0_4_ * 1.9073486e-06;
            local_880 = vshufps_avx(auVar120,auVar120,0xff);
            local_8e0._4_4_ = (float)local_980._4_4_ + local_420._4_4_;
            local_8e0._0_4_ = (float)local_980._0_4_ + local_420._0_4_;
            fStack_8d8 = fStack_978 + local_420._8_4_;
            fStack_8d4 = fStack_974 + local_420._12_4_;
            fStack_8d0 = fStack_970 + local_420._16_4_;
            fStack_8cc = fStack_96c + local_420._20_4_;
            fStack_8c8 = fStack_968 + local_420._24_4_;
            fStack_8c4 = fStack_964 + local_420._28_4_;
            do {
              auVar111._8_4_ = 0x7f800000;
              auVar111._0_8_ = 0x7f8000007f800000;
              auVar111._12_4_ = 0x7f800000;
              auVar111._16_4_ = 0x7f800000;
              auVar111._20_4_ = 0x7f800000;
              auVar111._24_4_ = 0x7f800000;
              auVar111._28_4_ = 0x7f800000;
              auVar165 = vblendvps_avx(auVar111,auVar98,auVar97);
              auVar160 = vshufps_avx(auVar165,auVar165,0xb1);
              auVar160 = vminps_avx(auVar165,auVar160);
              auVar12 = vshufpd_avx(auVar160,auVar160,5);
              auVar160 = vminps_avx(auVar160,auVar12);
              auVar12 = vpermpd_avx2(auVar160,0x4e);
              auVar160 = vminps_avx(auVar160,auVar12);
              auVar160 = vcmpps_avx(auVar165,auVar160,0);
              auVar12 = auVar97 & auVar160;
              auVar165 = auVar97;
              if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar12 >> 0x7f,0) != '\0') ||
                    (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar12 >> 0xbf,0) != '\0') ||
                  (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar12[0x1f] < '\0') {
                auVar165 = vandps_avx(auVar160,auVar97);
              }
              uVar74 = vmovmskps_avx(auVar165);
              iVar21 = 0;
              for (; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
                iVar21 = iVar21 + 1;
              }
              uVar75 = iVar21 << 2;
              local_720 = auVar97;
              *(undefined4 *)(local_720 + uVar75) = 0;
              uVar74 = *(uint *)(local_1c0 + uVar75);
              uVar75 = *(uint *)(local_400 + uVar75);
              fVar117 = auVar6._0_4_;
              if ((float)local_a40._0_4_ < 0.0) {
                fVar117 = sqrtf((float)local_a40._0_4_);
              }
              local_a00._0_4_ = fVar117 * 1.9073486e-06;
              auVar8 = vinsertps_avx(ZEXT416(uVar75),ZEXT416(uVar74),0x10);
              bVar79 = true;
              uVar77 = 0;
              do {
                _local_a60 = vmovshdup_avx(auVar8);
                fVar150 = 1.0 - local_a60._0_4_;
                auVar152 = vshufps_avx(auVar8,auVar8,0x55);
                fVar117 = auVar152._0_4_;
                auVar127._0_4_ = fVar114 * fVar117;
                fVar141 = auVar152._4_4_;
                auVar127._4_4_ = auVar85._4_4_ * fVar141;
                fVar140 = auVar152._8_4_;
                auVar127._8_4_ = auVar85._8_4_ * fVar140;
                fVar143 = auVar152._12_4_;
                auVar127._12_4_ = auVar85._12_4_ * fVar143;
                auVar156._4_4_ = fVar150;
                auVar156._0_4_ = fVar150;
                auVar156._8_4_ = fVar150;
                auVar156._12_4_ = fVar150;
                auVar152 = vfmadd231ps_fma(auVar127,auVar156,auVar9);
                auVar173._0_4_ = fVar115 * fVar117;
                auVar173._4_4_ = auVar86._4_4_ * fVar141;
                auVar173._8_4_ = auVar86._8_4_ * fVar140;
                auVar173._12_4_ = auVar86._12_4_ * fVar143;
                auVar120 = vfmadd231ps_fma(auVar173,auVar156,auVar85);
                auVar217._0_4_ = fVar117 * auVar120._0_4_;
                auVar217._4_4_ = fVar141 * auVar120._4_4_;
                auVar217._8_4_ = fVar140 * auVar120._8_4_;
                auVar217._12_4_ = fVar143 * auVar120._12_4_;
                auVar84 = vfmadd231ps_fma(auVar217,auVar156,auVar152);
                auVar128._0_4_ = fVar117 * fVar116;
                auVar128._4_4_ = fVar141 * fStack_b9c;
                auVar128._8_4_ = fVar140 * fStack_b98;
                auVar128._12_4_ = fVar143 * fStack_b94;
                auVar152 = vfmadd231ps_fma(auVar128,auVar156,auVar86);
                auVar197._0_4_ = fVar117 * auVar152._0_4_;
                auVar197._4_4_ = fVar141 * auVar152._4_4_;
                auVar197._8_4_ = fVar140 * auVar152._8_4_;
                auVar197._12_4_ = fVar143 * auVar152._12_4_;
                auVar120 = vfmadd231ps_fma(auVar197,auVar156,auVar120);
                fVar145 = auVar8._0_4_;
                auVar129._4_4_ = fVar145;
                auVar129._0_4_ = fVar145;
                auVar129._8_4_ = fVar145;
                auVar129._12_4_ = fVar145;
                auVar152 = vfmadd213ps_fma(auVar129,local_a30,_DAT_01f7aa10);
                auVar92._0_4_ = fVar117 * auVar120._0_4_;
                auVar92._4_4_ = fVar141 * auVar120._4_4_;
                auVar92._8_4_ = fVar140 * auVar120._8_4_;
                auVar92._12_4_ = fVar143 * auVar120._12_4_;
                auVar93 = vfmadd231ps_fma(auVar92,auVar84,auVar156);
                local_9c0._0_16_ = auVar93;
                auVar152 = vsubps_avx(auVar152,auVar93);
                _local_ac0 = auVar152;
                auVar152 = vdpps_avx(auVar152,auVar152,0x7f);
                fVar117 = auVar152._0_4_;
                if (fVar117 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar150);
                  auVar113._0_4_ = sqrtf(fVar117);
                  auVar113._4_60_ = extraout_var_00;
                  auVar93 = auVar113._0_16_;
                  auVar89 = local_9e0._0_16_;
                }
                else {
                  auVar93 = vsqrtss_avx(auVar152,auVar152);
                  auVar89 = ZEXT416((uint)fVar150);
                }
                auVar120 = vsubps_avx(auVar120,auVar84);
                auVar227._0_4_ = auVar120._0_4_ * 3.0;
                auVar227._4_4_ = auVar120._4_4_ * 3.0;
                auVar227._8_4_ = auVar120._8_4_ * 3.0;
                auVar227._12_4_ = auVar120._12_4_ * 3.0;
                auVar120 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar89,_local_a60);
                auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_a60,auVar89);
                fVar141 = auVar89._0_4_ * 6.0;
                fVar140 = auVar120._0_4_ * 6.0;
                fVar143 = auVar84._0_4_ * 6.0;
                fVar150 = local_a60._0_4_ * 6.0;
                auVar174._0_4_ = fVar150 * fVar116;
                auVar174._4_4_ = fVar150 * fStack_b9c;
                auVar174._8_4_ = fVar150 * fStack_b98;
                auVar174._12_4_ = fVar150 * fStack_b94;
                auVar130._4_4_ = fVar143;
                auVar130._0_4_ = fVar143;
                auVar130._8_4_ = fVar143;
                auVar130._12_4_ = fVar143;
                auVar120 = vfmadd132ps_fma(auVar130,auVar174,auVar86);
                auVar175._4_4_ = fVar140;
                auVar175._0_4_ = fVar140;
                auVar175._8_4_ = fVar140;
                auVar175._12_4_ = fVar140;
                auVar120 = vfmadd132ps_fma(auVar175,auVar120,auVar85);
                auVar84 = vdpps_avx(auVar227,auVar227,0x7f);
                auVar131._4_4_ = fVar141;
                auVar131._0_4_ = fVar141;
                auVar131._8_4_ = fVar141;
                auVar131._12_4_ = fVar141;
                auVar193 = vfmadd132ps_fma(auVar131,auVar120,auVar9);
                auVar120 = vblendps_avx(auVar84,_DAT_01f7aa10,0xe);
                auVar89 = vrsqrtss_avx(auVar120,auVar120);
                fVar143 = auVar84._0_4_;
                fVar141 = auVar89._0_4_;
                auVar89 = vdpps_avx(auVar227,auVar193,0x7f);
                fVar141 = fVar141 * 1.5 + fVar143 * -0.5 * fVar141 * fVar141 * fVar141;
                auVar132._0_4_ = auVar193._0_4_ * fVar143;
                auVar132._4_4_ = auVar193._4_4_ * fVar143;
                auVar132._8_4_ = auVar193._8_4_ * fVar143;
                auVar132._12_4_ = auVar193._12_4_ * fVar143;
                fVar140 = auVar89._0_4_;
                auVar218._0_4_ = auVar227._0_4_ * fVar140;
                auVar218._4_4_ = auVar227._4_4_ * fVar140;
                auVar218._8_4_ = auVar227._8_4_ * fVar140;
                auVar218._12_4_ = auVar227._12_4_ * fVar140;
                auVar89 = vsubps_avx(auVar132,auVar218);
                auVar120 = vrcpss_avx(auVar120,auVar120);
                auVar193 = vfnmadd213ss_fma(auVar120,auVar84,ZEXT416(0x40000000));
                fVar140 = auVar120._0_4_ * auVar193._0_4_;
                auVar120 = vmaxss_avx(ZEXT416((uint)fVar118),
                                      ZEXT416((uint)(fVar145 * (float)local_a00._0_4_)));
                auVar248 = ZEXT1664(auVar120);
                uVar57 = CONCAT44(auVar227._4_4_,auVar227._0_4_);
                auVar245._0_8_ = uVar57 ^ 0x8000000080000000;
                auVar245._8_4_ = -auVar227._8_4_;
                auVar245._12_4_ = -auVar227._12_4_;
                local_aa0._0_4_ = fVar141 * auVar89._0_4_ * fVar140;
                local_aa0._4_4_ = fVar141 * auVar89._4_4_ * fVar140;
                local_aa0._8_4_ = fVar141 * auVar89._8_4_ * fVar140;
                local_aa0._12_4_ = fVar141 * auVar89._12_4_ * fVar140;
                local_a80._0_4_ = auVar227._0_4_ * fVar141;
                local_a80._4_4_ = auVar227._4_4_ * fVar141;
                local_a80._8_4_ = auVar227._8_4_ * fVar141;
                local_a80._12_4_ = auVar227._12_4_ * fVar141;
                _local_a60 = auVar227;
                local_9e0._0_4_ = auVar120._0_4_;
                if (fVar143 < -fVar143) {
                  fVar141 = sqrtf(fVar143);
                  auVar93 = ZEXT416(auVar93._0_4_);
                  auVar248 = ZEXT464((uint)local_9e0._0_4_);
                }
                else {
                  auVar120 = vsqrtss_avx(auVar84,auVar84);
                  fVar141 = auVar120._0_4_;
                }
                auVar120 = vdpps_avx(_local_ac0,local_a80._0_16_,0x7f);
                auVar193 = vfmadd213ss_fma(ZEXT416((uint)fVar118),auVar93,auVar248._0_16_);
                auVar84 = vdpps_avx(auVar245,local_a80._0_16_,0x7f);
                auVar89 = vdpps_avx(_local_ac0,local_aa0._0_16_,0x7f);
                local_a80._0_16_ = vdpps_avx(local_a30,local_a80._0_16_,0x7f);
                auVar193 = vfmadd213ss_fma(ZEXT416((uint)(auVar93._0_4_ + 1.0)),
                                           ZEXT416((uint)(fVar118 / fVar141)),auVar193);
                fVar141 = auVar84._0_4_ + auVar89._0_4_;
                fVar143 = auVar120._0_4_;
                auVar94._0_4_ = fVar143 * fVar143;
                auVar94._4_4_ = auVar120._4_4_ * auVar120._4_4_;
                auVar94._8_4_ = auVar120._8_4_ * auVar120._8_4_;
                auVar94._12_4_ = auVar120._12_4_ * auVar120._12_4_;
                auVar84 = vdpps_avx(_local_ac0,auVar245,0x7f);
                auVar89 = vsubps_avx(auVar152,auVar94);
                auVar93 = vrsqrtss_avx(auVar89,auVar89);
                fVar150 = auVar89._0_4_;
                fVar140 = auVar93._0_4_;
                fVar140 = fVar140 * 1.5 + fVar150 * -0.5 * fVar140 * fVar140 * fVar140;
                auVar93 = vdpps_avx(_local_ac0,local_a30,0x7f);
                local_aa0._0_16_ = vfnmadd231ss_fma(auVar84,auVar120,ZEXT416((uint)fVar141));
                auVar84 = vfnmadd231ss_fma(auVar93,auVar120,local_a80._0_16_);
                if (fVar150 < 0.0) {
                  local_820._0_16_ = ZEXT416((uint)fVar141);
                  local_840._0_4_ = fVar140;
                  local_860._0_16_ = auVar84;
                  fVar150 = sqrtf(fVar150);
                  auVar248 = ZEXT464((uint)local_9e0._0_4_);
                  fVar140 = (float)local_840._0_4_;
                  auVar84 = local_860._0_16_;
                  auVar93 = local_820._0_16_;
                }
                else {
                  auVar93 = vsqrtss_avx(auVar89,auVar89);
                  fVar150 = auVar93._0_4_;
                  auVar93 = ZEXT416((uint)fVar141);
                }
                auVar261 = ZEXT1664(_local_a60);
                auVar89 = vpermilps_avx(local_9c0._0_16_,0xff);
                fVar150 = fVar150 - auVar89._0_4_;
                auVar89 = vshufps_avx(_local_a60,_local_a60,0xff);
                auVar83 = vfmsub213ss_fma(local_aa0._0_16_,ZEXT416((uint)fVar140),auVar89);
                auVar176._0_8_ = local_a80._0_8_ ^ 0x8000000080000000;
                auVar176._8_4_ = local_a80._8_4_ ^ 0x80000000;
                auVar176._12_4_ = local_a80._12_4_ ^ 0x80000000;
                auVar198._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
                auVar198._8_4_ = auVar83._8_4_ ^ 0x80000000;
                auVar198._12_4_ = auVar83._12_4_ ^ 0x80000000;
                auVar84 = ZEXT416((uint)(auVar84._0_4_ * fVar140));
                auVar83 = vfmsub231ss_fma(ZEXT416((uint)(local_a80._0_4_ * auVar83._0_4_)),auVar93,
                                          auVar84);
                auVar84 = vinsertps_avx(auVar198,auVar84,0x1c);
                uVar81 = auVar83._0_4_;
                auVar199._4_4_ = uVar81;
                auVar199._0_4_ = uVar81;
                auVar199._8_4_ = uVar81;
                auVar199._12_4_ = uVar81;
                auVar84 = vdivps_avx(auVar84,auVar199);
                auVar93 = vinsertps_avx(auVar93,auVar176,0x10);
                auVar93 = vdivps_avx(auVar93,auVar199);
                auVar157._0_4_ = fVar143 * auVar84._0_4_ + fVar150 * auVar93._0_4_;
                auVar157._4_4_ = fVar143 * auVar84._4_4_ + fVar150 * auVar93._4_4_;
                auVar157._8_4_ = fVar143 * auVar84._8_4_ + fVar150 * auVar93._8_4_;
                auVar157._12_4_ = fVar143 * auVar84._12_4_ + fVar150 * auVar93._12_4_;
                auVar8 = vsubps_avx(auVar8,auVar157);
                auVar120 = vandps_avx(auVar120,auVar231);
                if (auVar120._0_4_ < auVar193._0_4_) {
                  auVar84 = vfmadd231ss_fma(ZEXT416((uint)(auVar248._0_4_ + auVar193._0_4_)),
                                            local_880,ZEXT416(0x36000000));
                  auVar120 = vandps_avx(ZEXT416((uint)fVar150),auVar231);
                  if (auVar120._0_4_ < auVar84._0_4_) {
                    fVar141 = auVar8._0_4_ + (float)local_940._0_4_;
                    if (fVar141 < fVar80) {
                      bVar70 = 0;
                      goto LAB_0163cda3;
                    }
                    fVar140 = *(float *)(ray + k * 4 + 0x100);
                    if (fVar140 < fVar141) {
                      bVar70 = 0;
                      goto LAB_0163cda3;
                    }
                    auVar8 = vmovshdup_avx(auVar8);
                    bVar70 = 0;
                    if ((auVar8._0_4_ < 0.0) || (bVar70 = 0, 1.0 < auVar8._0_4_)) goto LAB_0163cda3;
                    auVar152 = vrsqrtss_avx(auVar152,auVar152);
                    fVar143 = auVar152._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar71].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar70 = 0;
                      goto LAB_0163cda3;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar70 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_0163cda3;
                    fVar117 = fVar143 * 1.5 + fVar117 * -0.5 * fVar143 * fVar143 * fVar143;
                    auVar177._0_4_ = fVar117 * (float)local_ac0._0_4_;
                    auVar177._4_4_ = fVar117 * (float)local_ac0._4_4_;
                    auVar177._8_4_ = fVar117 * fStack_ab8;
                    auVar177._12_4_ = fVar117 * fStack_ab4;
                    auVar93 = vfmadd213ps_fma(auVar89,auVar177,_local_a60);
                    auVar152 = vshufps_avx(auVar177,auVar177,0xc9);
                    auVar120 = vshufps_avx(_local_a60,_local_a60,0xc9);
                    auVar178._0_4_ = auVar177._0_4_ * auVar120._0_4_;
                    auVar178._4_4_ = auVar177._4_4_ * auVar120._4_4_;
                    auVar178._8_4_ = auVar177._8_4_ * auVar120._8_4_;
                    auVar178._12_4_ = auVar177._12_4_ * auVar120._12_4_;
                    auVar84 = vfmsub231ps_fma(auVar178,_local_a60,auVar152);
                    auVar152 = vshufps_avx(auVar84,auVar84,0xc9);
                    auVar120 = vshufps_avx(auVar93,auVar93,0xc9);
                    auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                    auVar95._0_4_ = auVar93._0_4_ * auVar84._0_4_;
                    auVar95._4_4_ = auVar93._4_4_ * auVar84._4_4_;
                    auVar95._8_4_ = auVar93._8_4_ * auVar84._8_4_;
                    auVar95._12_4_ = auVar93._12_4_ * auVar84._12_4_;
                    auVar152 = vfmsub231ps_fma(auVar95,auVar152,auVar120);
                    local_4e0 = auVar8._0_8_;
                    auVar8 = vmovshdup_avx(auVar152);
                    local_540._8_8_ = auVar8._0_8_;
                    auVar8 = vshufps_avx(auVar152,auVar152,0xaa);
                    local_520 = auVar8._0_8_;
                    local_500 = auVar152._0_4_;
                    local_540._0_8_ = local_540._8_8_;
                    local_540._16_8_ = local_540._8_8_;
                    local_540._24_8_ = local_540._8_8_;
                    uStack_518 = local_520;
                    uStack_510 = local_520;
                    uStack_508 = local_520;
                    uStack_4fc = local_500;
                    uStack_4f8 = local_500;
                    uStack_4f4 = local_500;
                    uStack_4f0 = local_500;
                    uStack_4ec = local_500;
                    uStack_4e8 = local_500;
                    uStack_4e4 = local_500;
                    uStack_4d8 = local_4e0;
                    uStack_4d0 = local_4e0;
                    uStack_4c8 = local_4e0;
                    auVar158._12_4_ = 0;
                    auVar158._0_12_ = ZEXT812(0);
                    auVar158 = auVar158 << 0x20;
                    local_4c0 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_4a0 = CONCAT44(uStack_65c,local_660);
                    uStack_498 = CONCAT44(uStack_654,uStack_658);
                    uStack_490 = CONCAT44(uStack_64c,uStack_650);
                    uStack_488 = CONCAT44(uStack_644,uStack_648);
                    local_480._4_4_ = uStack_63c;
                    local_480._0_4_ = local_640;
                    local_480._8_4_ = uStack_638;
                    local_480._12_4_ = uStack_634;
                    local_480._16_4_ = uStack_630;
                    local_480._20_4_ = uStack_62c;
                    local_480._24_4_ = uStack_628;
                    local_480._28_4_ = uStack_624;
                    vpcmpeqd_avx2(local_480,local_480);
                    local_460 = context->user->instID[0];
                    uStack_45c = local_460;
                    uStack_458 = local_460;
                    uStack_454 = local_460;
                    uStack_450 = local_460;
                    uStack_44c = local_460;
                    uStack_448 = local_460;
                    uStack_444 = local_460;
                    local_440 = context->user->instPrimID[0];
                    uStack_43c = local_440;
                    uStack_438 = local_440;
                    uStack_434 = local_440;
                    uStack_430 = local_440;
                    uStack_42c = local_440;
                    uStack_428 = local_440;
                    uStack_424 = local_440;
                    *(float *)(ray + k * 4 + 0x100) = fVar141;
                    local_960 = local_6a0;
                    local_b10.valid = (int *)local_960;
                    local_b10.geometryUserPtr = pGVar2->userPtr;
                    local_b10.context = context->user;
                    local_b10.hit = (RTCHitN *)local_540;
                    local_b10.N = 8;
                    local_b10.ray = (RTCRayN *)ray;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar261 = ZEXT1664(_local_a60);
                      (*pGVar2->occlusionFilterN)(&local_b10);
                      auVar158 = ZEXT816(0) << 0x40;
                    }
                    auVar165 = ZEXT1632(auVar158);
                    auVar97 = vpcmpeqd_avx2(local_960,auVar165);
                    auVar97 = _DAT_01fe9960 & ~auVar97;
                    if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar97 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar97 >> 0x7f,0) != '\0') ||
                          (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar97 >> 0xbf,0) != '\0') ||
                        (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar97[0x1f] < '\0') {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar261 = ZEXT1664(auVar261._0_16_);
                        (*p_Var3)(&local_b10);
                        auVar165 = ZEXT832(0) << 0x40;
                      }
                      auVar165 = vpcmpeqd_avx2(local_960,auVar165);
                      auVar138._8_4_ = 0xff800000;
                      auVar138._0_8_ = 0xff800000ff800000;
                      auVar138._12_4_ = 0xff800000;
                      auVar138._16_4_ = 0xff800000;
                      auVar138._20_4_ = 0xff800000;
                      auVar138._24_4_ = 0xff800000;
                      auVar138._28_4_ = 0xff800000;
                      auVar97 = vblendvps_avx(auVar138,*(undefined1 (*) [32])(local_b10.ray + 0x100)
                                              ,auVar165);
                      *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar97;
                      auVar97 = _DAT_01fe9960 & ~auVar165;
                      if ((((((((auVar97 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar97 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar97 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar97 >> 0x7f,0) != '\0') ||
                            (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar97 >> 0xbf,0) != '\0') ||
                          (auVar97 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar97[0x1f] < '\0') {
                        bVar70 = 1;
                        goto LAB_0163cda3;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar140;
                    bVar70 = 0;
                    goto LAB_0163cda3;
                  }
                }
                bVar79 = uVar77 < 4;
                uVar77 = uVar77 + 1;
              } while (uVar77 != 5);
              bVar79 = false;
              bVar70 = 5;
LAB_0163cda3:
              bVar78 = (bool)(bVar78 | bVar79 & bVar70);
              uVar81 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar109._4_4_ = uVar81;
              auVar109._0_4_ = uVar81;
              auVar109._8_4_ = uVar81;
              auVar109._12_4_ = uVar81;
              auVar109._16_4_ = uVar81;
              auVar109._20_4_ = uVar81;
              auVar109._24_4_ = uVar81;
              auVar109._28_4_ = uVar81;
              auVar165 = vcmpps_avx(_local_8e0,auVar109,2);
              auVar97 = vandps_avx(auVar165,local_720);
              auVar165 = local_720 & auVar165;
              local_720 = auVar97;
            } while ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar165 >> 0x7f,0) != '\0') ||
                       (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar165 >> 0xbf,0) != '\0') ||
                     (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar165[0x1f] < '\0');
          }
          auVar166._0_4_ = (float)local_980._0_4_ + local_580._0_4_;
          auVar166._4_4_ = (float)local_980._4_4_ + local_580._4_4_;
          auVar166._8_4_ = fStack_978 + local_580._8_4_;
          auVar166._12_4_ = fStack_974 + local_580._12_4_;
          auVar166._16_4_ = fStack_970 + local_580._16_4_;
          auVar166._20_4_ = fStack_96c + local_580._20_4_;
          auVar166._24_4_ = fStack_968 + local_580._24_4_;
          auVar166._28_4_ = fStack_964 + local_580._28_4_;
          auVar165 = vcmpps_avx(auVar166,auVar109,2);
          auVar97 = vandps_avx(local_760,local_740);
          auVar97 = vandps_avx(auVar165,auVar97);
          auVar186._0_4_ = (float)local_980._0_4_ + local_420._0_4_;
          auVar186._4_4_ = (float)local_980._4_4_ + local_420._4_4_;
          auVar186._8_4_ = fStack_978 + local_420._8_4_;
          auVar186._12_4_ = fStack_974 + local_420._12_4_;
          auVar186._16_4_ = fStack_970 + local_420._16_4_;
          auVar186._20_4_ = fStack_96c + local_420._20_4_;
          auVar186._24_4_ = fStack_968 + local_420._24_4_;
          auVar186._28_4_ = fStack_964 + local_420._28_4_;
          auVar98 = vcmpps_avx(auVar186,auVar109,2);
          auVar165 = vandps_avx(_local_920,local_900);
          auVar165 = vandps_avx(auVar98,auVar165);
          auVar165 = vorps_avx(auVar97,auVar165);
          if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar165 >> 0x7f,0) != '\0') ||
                (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar165 >> 0xbf,0) != '\0') ||
              (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar165[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar76 * 0x60) = auVar165;
            auVar97 = vblendvps_avx(local_420,local_580,auVar97);
            *(undefined1 (*) [32])(auStack_160 + uVar76 * 0x60) = auVar97;
            uVar82 = vmovlps_avx(local_6b0);
            (&uStack_140)[uVar76 * 0xc] = uVar82;
            aiStack_138[uVar76 * 0x18] = local_cc4 + 1;
            iVar72 = iVar72 + 1;
          }
        }
      }
    }
    if (iVar72 == 0) break;
    uVar81 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar106._4_4_ = uVar81;
    auVar106._0_4_ = uVar81;
    auVar106._8_4_ = uVar81;
    auVar106._12_4_ = uVar81;
    auVar106._16_4_ = uVar81;
    auVar106._20_4_ = uVar81;
    auVar106._24_4_ = uVar81;
    auVar106._28_4_ = uVar81;
    uVar74 = -iVar72;
    pauVar73 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar72 - 1) * 0x60);
    fVar118 = (float)local_980._0_4_;
    fVar117 = (float)local_980._4_4_;
    fVar141 = fStack_978;
    fVar140 = fStack_974;
    fVar143 = fStack_970;
    fVar150 = fStack_96c;
    fVar145 = fStack_968;
    fVar142 = fStack_964;
    while( true ) {
      auVar97 = pauVar73[1];
      auVar133._0_4_ = fVar118 + auVar97._0_4_;
      auVar133._4_4_ = fVar117 + auVar97._4_4_;
      auVar133._8_4_ = fVar141 + auVar97._8_4_;
      auVar133._12_4_ = fVar140 + auVar97._12_4_;
      auVar133._16_4_ = fVar143 + auVar97._16_4_;
      auVar133._20_4_ = fVar150 + auVar97._20_4_;
      auVar133._24_4_ = fVar145 + auVar97._24_4_;
      auVar133._28_4_ = fVar142 + auVar97._28_4_;
      auVar98 = vcmpps_avx(auVar133,auVar106,2);
      auVar165 = vandps_avx(auVar98,*pauVar73);
      local_540 = auVar165;
      auVar98 = *pauVar73 & auVar98;
      if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar98 >> 0x7f,0) != '\0') ||
            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar98 >> 0xbf,0) != '\0') ||
          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar98[0x1f] < '\0') break;
      pauVar73 = pauVar73 + -3;
      uVar74 = uVar74 + 1;
      fVar118 = (float)local_980._0_4_;
      fVar117 = (float)local_980._4_4_;
      fVar141 = fStack_978;
      fVar140 = fStack_974;
      fVar143 = fStack_970;
      fVar150 = fStack_96c;
      fVar145 = fStack_968;
      fVar142 = fStack_964;
      if (uVar74 == 0) goto LAB_0163d27c;
    }
    auVar107._8_4_ = 0x7f800000;
    auVar107._0_8_ = 0x7f8000007f800000;
    auVar107._12_4_ = 0x7f800000;
    auVar107._16_4_ = 0x7f800000;
    auVar107._20_4_ = 0x7f800000;
    auVar107._24_4_ = 0x7f800000;
    auVar107._28_4_ = 0x7f800000;
    auVar97 = vblendvps_avx(auVar107,auVar97,auVar165);
    auVar98 = vshufps_avx(auVar97,auVar97,0xb1);
    auVar98 = vminps_avx(auVar97,auVar98);
    auVar160 = vshufpd_avx(auVar98,auVar98,5);
    auVar98 = vminps_avx(auVar98,auVar160);
    auVar160 = vpermpd_avx2(auVar98,0x4e);
    auVar98 = vminps_avx(auVar98,auVar160);
    auVar97 = vcmpps_avx(auVar97,auVar98,0);
    auVar98 = auVar165 & auVar97;
    auVar248 = ZEXT3264(auVar238);
    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar98 >> 0x7f,0) != '\0') ||
          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar98 >> 0xbf,0) != '\0') ||
        (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar98[0x1f] < '\0')
    {
      auVar165 = vandps_avx(auVar97,auVar165);
    }
    uVar77 = *(ulong *)pauVar73[2];
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar77;
    uVar75 = vmovmskps_avx(auVar165);
    iVar72 = 0;
    for (; (uVar75 & 1) == 0; uVar75 = uVar75 >> 1 | 0x80000000) {
      iVar72 = iVar72 + 1;
    }
    *(undefined4 *)(local_540 + (uint)(iVar72 << 2)) = 0;
    uVar75 = ~uVar74;
    if ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_540 >> 0x7f,0) != '\0') ||
          (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_540 >> 0xbf,0) != '\0') ||
        (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_540[0x1f] < '\0') {
      uVar75 = -uVar74;
    }
    uVar76 = (ulong)uVar75;
    local_cc4 = *(int *)(pauVar73[2] + 8);
    *pauVar73 = local_540;
    uVar81 = (undefined4)uVar77;
    auVar134._4_4_ = uVar81;
    auVar134._0_4_ = uVar81;
    auVar134._8_4_ = uVar81;
    auVar134._12_4_ = uVar81;
    auVar134._16_4_ = uVar81;
    auVar134._20_4_ = uVar81;
    auVar134._24_4_ = uVar81;
    auVar134._28_4_ = uVar81;
    auVar8 = vmovshdup_avx(auVar87);
    auVar8 = vsubps_avx(auVar8,auVar87);
    auVar108._0_4_ = auVar8._0_4_;
    auVar108._4_4_ = auVar108._0_4_;
    auVar108._8_4_ = auVar108._0_4_;
    auVar108._12_4_ = auVar108._0_4_;
    auVar108._16_4_ = auVar108._0_4_;
    auVar108._20_4_ = auVar108._0_4_;
    auVar108._24_4_ = auVar108._0_4_;
    auVar108._28_4_ = auVar108._0_4_;
    auVar8 = vfmadd132ps_fma(auVar108,auVar134,_DAT_01faff20);
    local_580 = ZEXT1632(auVar8);
    local_6b0._8_8_ = 0;
    local_6b0._0_8_ = *(ulong *)(local_580 + (uint)(iVar72 << 2));
    auVar97 = auVar201;
  } while( true );
LAB_0163d27c:
  if (bVar78 != false) {
    return bVar78;
  }
  uVar81 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar96._4_4_ = uVar81;
  auVar96._0_4_ = uVar81;
  auVar96._8_4_ = uVar81;
  auVar96._12_4_ = uVar81;
  auVar4 = vcmpps_avx(local_6c0,auVar96,2);
  uVar71 = vmovmskps_avx(auVar4);
  uVar71 = (uint)local_928 & uVar71;
  if (uVar71 == 0) {
    return false;
  }
  goto LAB_0163ab5f;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }